

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersector1<8>::
     intersect_t<embree::avx512::SweepCurve1Intersector1<embree::CatmullRomCurveT>,embree::avx512::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  byte bVar72;
  byte bVar73;
  byte bVar74;
  ulong uVar75;
  byte bVar76;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  ulong uVar77;
  undefined8 in_R10;
  long lVar78;
  bool bVar79;
  ulong uVar80;
  uint uVar81;
  uint uVar132;
  uint uVar133;
  uint uVar135;
  uint uVar136;
  uint uVar137;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  uint uVar134;
  uint uVar138;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  float pp;
  float fVar139;
  undefined4 uVar140;
  undefined1 auVar141 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar142 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  float fVar169;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar170;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  float fVar204;
  float fVar205;
  float fVar206;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar207;
  float fVar208;
  float fVar209;
  undefined1 auVar203 [32];
  float fVar210;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [64];
  float fVar223;
  float fVar224;
  float fVar225;
  undefined1 auVar222 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar230 [64];
  float fVar231;
  float fVar237;
  float fVar238;
  undefined1 auVar232 [16];
  float fVar239;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [64];
  undefined1 auVar240 [28];
  undefined1 auVar241 [32];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [64];
  float s;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [32];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_914;
  ulong local_910;
  ulong local_908;
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7d0 [16];
  undefined1 local_7c0 [16];
  undefined1 local_7b0 [16];
  RTCFilterFunctionNArguments local_7a0;
  int local_76c;
  uint local_768;
  uint local_764;
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined8 local_6a0;
  float local_698;
  float local_694;
  undefined4 local_690;
  uint local_68c;
  uint local_688;
  uint local_684;
  uint local_680;
  Primitive *local_670;
  ulong local_668;
  undefined1 local_660 [32];
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_570 [16];
  undefined1 local_560 [16];
  float local_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined4 local_4a0;
  undefined4 uStack_49c;
  undefined4 uStack_498;
  undefined4 uStack_494;
  undefined4 uStack_490;
  undefined4 uStack_48c;
  undefined4 uStack_488;
  undefined4 uStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [8];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar121 [32];
  undefined1 auVar236 [64];
  
  uVar80 = (ulong)(byte)prim[1];
  fVar210 = *(float *)(prim + uVar80 * 0x19 + 0x12);
  auVar89 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar80 * 0x19 + 6));
  fVar169 = fVar210 * auVar89._0_4_;
  fVar139 = fVar210 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar80 * 4 + 6);
  auVar95 = vpmovsxbd_avx2(auVar84);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar80 * 5 + 6);
  auVar93 = vpmovsxbd_avx2(auVar85);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar80 * 6 + 6);
  auVar96 = vpmovsxbd_avx2(auVar82);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar80 * 0xb + 6);
  auVar97 = vpmovsxbd_avx2(auVar86);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar80 * 0xc + 6);
  auVar98 = vpmovsxbd_avx2(auVar83);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar80 * 0xd + 6);
  auVar94 = vpmovsxbd_avx2(auVar87);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar80 * 0x12 + 6);
  auVar99 = vpmovsxbd_avx2(auVar88);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar80 * 0x13 + 6);
  auVar100 = vpmovsxbd_avx2(auVar3);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar246 = ZEXT3264(auVar100);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar80 * 0x14 + 6);
  auVar102 = vpmovsxbd_avx2(auVar4);
  auVar101 = vcvtdq2ps_avx(auVar102);
  auVar111._4_4_ = fVar139;
  auVar111._0_4_ = fVar139;
  auVar111._8_4_ = fVar139;
  auVar111._12_4_ = fVar139;
  auVar111._16_4_ = fVar139;
  auVar111._20_4_ = fVar139;
  auVar111._24_4_ = fVar139;
  auVar111._28_4_ = fVar139;
  auVar113._8_4_ = 1;
  auVar113._0_8_ = 0x100000001;
  auVar113._12_4_ = 1;
  auVar113._16_4_ = 1;
  auVar113._20_4_ = 1;
  auVar113._24_4_ = 1;
  auVar113._28_4_ = 1;
  auVar90 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar92 = ZEXT1632(CONCAT412(fVar210 * (ray->super_RayK<1>).dir.field_0.m128[3],
                               CONCAT48(fVar210 * (ray->super_RayK<1>).dir.field_0.m128[2],
                                        CONCAT44(fVar210 * (ray->super_RayK<1>).dir.field_0.m128[1],
                                                 fVar139))));
  auVar103 = vpermps_avx2(auVar113,auVar92);
  auVar91 = vpermps_avx512vl(auVar90,auVar92);
  fVar139 = auVar91._0_4_;
  auVar230._0_4_ = fVar139 * auVar96._0_4_;
  fVar204 = auVar91._4_4_;
  auVar230._4_4_ = fVar204 * auVar96._4_4_;
  fVar205 = auVar91._8_4_;
  auVar230._8_4_ = fVar205 * auVar96._8_4_;
  fVar206 = auVar91._12_4_;
  auVar230._12_4_ = fVar206 * auVar96._12_4_;
  fVar207 = auVar91._16_4_;
  auVar230._16_4_ = fVar207 * auVar96._16_4_;
  fVar208 = auVar91._20_4_;
  auVar230._20_4_ = fVar208 * auVar96._20_4_;
  fVar209 = auVar91._24_4_;
  auVar230._28_36_ = in_ZMM4._28_36_;
  auVar230._24_4_ = fVar209 * auVar96._24_4_;
  auVar92._4_4_ = auVar94._4_4_ * fVar204;
  auVar92._0_4_ = auVar94._0_4_ * fVar139;
  auVar92._8_4_ = auVar94._8_4_ * fVar205;
  auVar92._12_4_ = auVar94._12_4_ * fVar206;
  auVar92._16_4_ = auVar94._16_4_ * fVar207;
  auVar92._20_4_ = auVar94._20_4_ * fVar208;
  auVar92._24_4_ = auVar94._24_4_ * fVar209;
  auVar92._28_4_ = auVar102._28_4_;
  auVar102._4_4_ = auVar101._4_4_ * fVar204;
  auVar102._0_4_ = auVar101._0_4_ * fVar139;
  auVar102._8_4_ = auVar101._8_4_ * fVar205;
  auVar102._12_4_ = auVar101._12_4_ * fVar206;
  auVar102._16_4_ = auVar101._16_4_ * fVar207;
  auVar102._20_4_ = auVar101._20_4_ * fVar208;
  auVar102._24_4_ = auVar101._24_4_ * fVar209;
  auVar102._28_4_ = auVar91._28_4_;
  auVar84 = vfmadd231ps_fma(auVar230._0_32_,auVar103,auVar93);
  auVar85 = vfmadd231ps_fma(auVar92,auVar103,auVar98);
  auVar82 = vfmadd231ps_fma(auVar102,auVar100,auVar103);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar111,auVar95);
  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar111,auVar97);
  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar99,auVar111);
  auVar112._4_4_ = fVar169;
  auVar112._0_4_ = fVar169;
  auVar112._8_4_ = fVar169;
  auVar112._12_4_ = fVar169;
  auVar112._16_4_ = fVar169;
  auVar112._20_4_ = fVar169;
  auVar112._24_4_ = fVar169;
  auVar112._28_4_ = fVar169;
  auVar103 = ZEXT1632(CONCAT412(fVar210 * auVar89._12_4_,
                                CONCAT48(fVar210 * auVar89._8_4_,
                                         CONCAT44(fVar210 * auVar89._4_4_,fVar169))));
  auVar102 = vpermps_avx2(auVar113,auVar103);
  auVar92 = vpermps_avx512vl(auVar90,auVar103);
  fVar210 = auVar92._0_4_;
  fVar139 = auVar92._4_4_;
  auVar103._4_4_ = fVar139 * auVar96._4_4_;
  auVar103._0_4_ = fVar210 * auVar96._0_4_;
  fVar204 = auVar92._8_4_;
  auVar103._8_4_ = fVar204 * auVar96._8_4_;
  fVar205 = auVar92._12_4_;
  auVar103._12_4_ = fVar205 * auVar96._12_4_;
  fVar206 = auVar92._16_4_;
  auVar103._16_4_ = fVar206 * auVar96._16_4_;
  fVar207 = auVar92._20_4_;
  auVar103._20_4_ = fVar207 * auVar96._20_4_;
  fVar208 = auVar92._24_4_;
  auVar103._24_4_ = fVar208 * auVar96._24_4_;
  auVar103._28_4_ = 1;
  auVar90._4_4_ = auVar94._4_4_ * fVar139;
  auVar90._0_4_ = auVar94._0_4_ * fVar210;
  auVar90._8_4_ = auVar94._8_4_ * fVar204;
  auVar90._12_4_ = auVar94._12_4_ * fVar205;
  auVar90._16_4_ = auVar94._16_4_ * fVar206;
  auVar90._20_4_ = auVar94._20_4_ * fVar207;
  auVar90._24_4_ = auVar94._24_4_ * fVar208;
  auVar90._28_4_ = auVar96._28_4_;
  auVar94._4_4_ = auVar101._4_4_ * fVar139;
  auVar94._0_4_ = auVar101._0_4_ * fVar210;
  auVar94._8_4_ = auVar101._8_4_ * fVar204;
  auVar94._12_4_ = auVar101._12_4_ * fVar205;
  auVar94._16_4_ = auVar101._16_4_ * fVar206;
  auVar94._20_4_ = auVar101._20_4_ * fVar207;
  auVar94._24_4_ = auVar101._24_4_ * fVar208;
  auVar94._28_4_ = auVar92._28_4_;
  auVar86 = vfmadd231ps_fma(auVar103,auVar102,auVar93);
  auVar83 = vfmadd231ps_fma(auVar90,auVar102,auVar98);
  auVar87 = vfmadd231ps_fma(auVar94,auVar102,auVar100);
  auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar112,auVar95);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar112,auVar97);
  auVar108._8_4_ = 0x7fffffff;
  auVar108._0_8_ = 0x7fffffff7fffffff;
  auVar108._12_4_ = 0x7fffffff;
  auVar108._16_4_ = 0x7fffffff;
  auVar108._20_4_ = 0x7fffffff;
  auVar108._24_4_ = 0x7fffffff;
  auVar108._28_4_ = 0x7fffffff;
  auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar112,auVar99);
  auVar95 = vandps_avx(ZEXT1632(auVar84),auVar108);
  auVar110._8_4_ = 0x219392ef;
  auVar110._0_8_ = 0x219392ef219392ef;
  auVar110._12_4_ = 0x219392ef;
  auVar110._16_4_ = 0x219392ef;
  auVar110._20_4_ = 0x219392ef;
  auVar110._24_4_ = 0x219392ef;
  auVar110._28_4_ = 0x219392ef;
  uVar75 = vcmpps_avx512vl(auVar95,auVar110,1);
  bVar79 = (bool)((byte)uVar75 & 1);
  auVar91._0_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar84._0_4_;
  bVar79 = (bool)((byte)(uVar75 >> 1) & 1);
  auVar91._4_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar84._4_4_;
  bVar79 = (bool)((byte)(uVar75 >> 2) & 1);
  auVar91._8_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar84._8_4_;
  bVar79 = (bool)((byte)(uVar75 >> 3) & 1);
  auVar91._12_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar84._12_4_;
  auVar91._16_4_ = (uint)((byte)(uVar75 >> 4) & 1) * 0x219392ef;
  auVar91._20_4_ = (uint)((byte)(uVar75 >> 5) & 1) * 0x219392ef;
  auVar91._24_4_ = (uint)((byte)(uVar75 >> 6) & 1) * 0x219392ef;
  auVar91._28_4_ = (uint)(byte)(uVar75 >> 7) * 0x219392ef;
  auVar95 = vandps_avx(ZEXT1632(auVar85),auVar108);
  uVar75 = vcmpps_avx512vl(auVar95,auVar110,1);
  bVar79 = (bool)((byte)uVar75 & 1);
  auVar104._0_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar85._0_4_;
  bVar79 = (bool)((byte)(uVar75 >> 1) & 1);
  auVar104._4_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar85._4_4_;
  bVar79 = (bool)((byte)(uVar75 >> 2) & 1);
  auVar104._8_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar85._8_4_;
  bVar79 = (bool)((byte)(uVar75 >> 3) & 1);
  auVar104._12_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar85._12_4_;
  auVar104._16_4_ = (uint)((byte)(uVar75 >> 4) & 1) * 0x219392ef;
  auVar104._20_4_ = (uint)((byte)(uVar75 >> 5) & 1) * 0x219392ef;
  auVar104._24_4_ = (uint)((byte)(uVar75 >> 6) & 1) * 0x219392ef;
  auVar104._28_4_ = (uint)(byte)(uVar75 >> 7) * 0x219392ef;
  auVar95 = vandps_avx(ZEXT1632(auVar82),auVar108);
  uVar75 = vcmpps_avx512vl(auVar95,auVar110,1);
  bVar79 = (bool)((byte)uVar75 & 1);
  auVar95._0_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar82._0_4_;
  bVar79 = (bool)((byte)(uVar75 >> 1) & 1);
  auVar95._4_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar82._4_4_;
  bVar79 = (bool)((byte)(uVar75 >> 2) & 1);
  auVar95._8_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar82._8_4_;
  bVar79 = (bool)((byte)(uVar75 >> 3) & 1);
  auVar95._12_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * auVar82._12_4_;
  auVar95._16_4_ = (uint)((byte)(uVar75 >> 4) & 1) * 0x219392ef;
  auVar95._20_4_ = (uint)((byte)(uVar75 >> 5) & 1) * 0x219392ef;
  auVar95._24_4_ = (uint)((byte)(uVar75 >> 6) & 1) * 0x219392ef;
  auVar95._28_4_ = (uint)(byte)(uVar75 >> 7) * 0x219392ef;
  auVar93 = vrcp14ps_avx512vl(auVar91);
  auVar109._8_4_ = 0x3f800000;
  auVar109._0_8_ = 0x3f8000003f800000;
  auVar109._12_4_ = 0x3f800000;
  auVar109._16_4_ = 0x3f800000;
  auVar109._20_4_ = 0x3f800000;
  auVar109._24_4_ = 0x3f800000;
  auVar109._28_4_ = 0x3f800000;
  auVar84 = vfnmadd213ps_fma(auVar91,auVar93,auVar109);
  auVar84 = vfmadd132ps_fma(ZEXT1632(auVar84),auVar93,auVar93);
  auVar93 = vrcp14ps_avx512vl(auVar104);
  auVar85 = vfnmadd213ps_fma(auVar104,auVar93,auVar109);
  auVar85 = vfmadd132ps_fma(ZEXT1632(auVar85),auVar93,auVar93);
  auVar93 = vrcp14ps_avx512vl(auVar95);
  auVar82 = vfnmadd213ps_fma(auVar95,auVar93,auVar109);
  auVar82 = vfmadd132ps_fma(ZEXT1632(auVar82),auVar93,auVar93);
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar80 * 7 + 6));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar86));
  auVar99._4_4_ = auVar84._4_4_ * auVar95._4_4_;
  auVar99._0_4_ = auVar84._0_4_ * auVar95._0_4_;
  auVar99._8_4_ = auVar84._8_4_ * auVar95._8_4_;
  auVar99._12_4_ = auVar84._12_4_ * auVar95._12_4_;
  auVar99._16_4_ = auVar95._16_4_ * 0.0;
  auVar99._20_4_ = auVar95._20_4_ * 0.0;
  auVar99._24_4_ = auVar95._24_4_ * 0.0;
  auVar99._28_4_ = auVar95._28_4_;
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar80 * 9 + 6));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar86));
  auVar107._0_4_ = auVar84._0_4_ * auVar95._0_4_;
  auVar107._4_4_ = auVar84._4_4_ * auVar95._4_4_;
  auVar107._8_4_ = auVar84._8_4_ * auVar95._8_4_;
  auVar107._12_4_ = auVar84._12_4_ * auVar95._12_4_;
  auVar107._16_4_ = auVar95._16_4_ * 0.0;
  auVar107._20_4_ = auVar95._20_4_ * 0.0;
  auVar107._24_4_ = auVar95._24_4_ * 0.0;
  auVar107._28_4_ = 0;
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar80 * 0xe + 6));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar83));
  auVar100._4_4_ = auVar85._4_4_ * auVar95._4_4_;
  auVar100._0_4_ = auVar85._0_4_ * auVar95._0_4_;
  auVar100._8_4_ = auVar85._8_4_ * auVar95._8_4_;
  auVar100._12_4_ = auVar85._12_4_ * auVar95._12_4_;
  auVar100._16_4_ = auVar95._16_4_ * 0.0;
  auVar100._20_4_ = auVar95._20_4_ * 0.0;
  auVar100._24_4_ = auVar95._24_4_ * 0.0;
  auVar100._28_4_ = auVar95._28_4_;
  auVar94 = vpbroadcastd_avx512vl();
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar83));
  auVar106._0_4_ = auVar85._0_4_ * auVar95._0_4_;
  auVar106._4_4_ = auVar85._4_4_ * auVar95._4_4_;
  auVar106._8_4_ = auVar85._8_4_ * auVar95._8_4_;
  auVar106._12_4_ = auVar85._12_4_ * auVar95._12_4_;
  auVar106._16_4_ = auVar95._16_4_ * 0.0;
  auVar106._20_4_ = auVar95._20_4_ * 0.0;
  auVar106._24_4_ = auVar95._24_4_ * 0.0;
  auVar106._28_4_ = 0;
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar80 * 0x15 + 6));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar87));
  auVar101._4_4_ = auVar95._4_4_ * auVar82._4_4_;
  auVar101._0_4_ = auVar95._0_4_ * auVar82._0_4_;
  auVar101._8_4_ = auVar95._8_4_ * auVar82._8_4_;
  auVar101._12_4_ = auVar95._12_4_ * auVar82._12_4_;
  auVar101._16_4_ = auVar95._16_4_ * 0.0;
  auVar101._20_4_ = auVar95._20_4_ * 0.0;
  auVar101._24_4_ = auVar95._24_4_ * 0.0;
  auVar101._28_4_ = auVar95._28_4_;
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar80 * 0x17 + 6));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar87));
  auVar105._0_4_ = auVar82._0_4_ * auVar95._0_4_;
  auVar105._4_4_ = auVar82._4_4_ * auVar95._4_4_;
  auVar105._8_4_ = auVar82._8_4_ * auVar95._8_4_;
  auVar105._12_4_ = auVar82._12_4_ * auVar95._12_4_;
  auVar105._16_4_ = auVar95._16_4_ * 0.0;
  auVar105._20_4_ = auVar95._20_4_ * 0.0;
  auVar105._24_4_ = auVar95._24_4_ * 0.0;
  auVar105._28_4_ = 0;
  auVar95 = vpminsd_avx2(auVar99,auVar107);
  auVar93 = vpminsd_avx2(auVar100,auVar106);
  auVar95 = vmaxps_avx(auVar95,auVar93);
  auVar93 = vpminsd_avx2(auVar101,auVar105);
  uVar140 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar96._4_4_ = uVar140;
  auVar96._0_4_ = uVar140;
  auVar96._8_4_ = uVar140;
  auVar96._12_4_ = uVar140;
  auVar96._16_4_ = uVar140;
  auVar96._20_4_ = uVar140;
  auVar96._24_4_ = uVar140;
  auVar96._28_4_ = uVar140;
  auVar93 = vmaxps_avx512vl(auVar93,auVar96);
  auVar95 = vmaxps_avx(auVar95,auVar93);
  auVar93._8_4_ = 0x3f7ffffa;
  auVar93._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar93._12_4_ = 0x3f7ffffa;
  auVar93._16_4_ = 0x3f7ffffa;
  auVar93._20_4_ = 0x3f7ffffa;
  auVar93._24_4_ = 0x3f7ffffa;
  auVar93._28_4_ = 0x3f7ffffa;
  local_2e0 = vmulps_avx512vl(auVar95,auVar93);
  auVar95 = vpmaxsd_avx2(auVar99,auVar107);
  auVar93 = vpmaxsd_avx2(auVar100,auVar106);
  auVar95 = vminps_avx(auVar95,auVar93);
  auVar93 = vpmaxsd_avx2(auVar101,auVar105);
  fVar210 = (ray->super_RayK<1>).tfar;
  auVar97._4_4_ = fVar210;
  auVar97._0_4_ = fVar210;
  auVar97._8_4_ = fVar210;
  auVar97._12_4_ = fVar210;
  auVar97._16_4_ = fVar210;
  auVar97._20_4_ = fVar210;
  auVar97._24_4_ = fVar210;
  auVar97._28_4_ = fVar210;
  auVar93 = vminps_avx512vl(auVar93,auVar97);
  auVar95 = vminps_avx(auVar95,auVar93);
  auVar98._8_4_ = 0x3f800003;
  auVar98._0_8_ = 0x3f8000033f800003;
  auVar98._12_4_ = 0x3f800003;
  auVar98._16_4_ = 0x3f800003;
  auVar98._20_4_ = 0x3f800003;
  auVar98._24_4_ = 0x3f800003;
  auVar98._28_4_ = 0x3f800003;
  auVar95 = vmulps_avx512vl(auVar95,auVar98);
  uVar14 = vcmpps_avx512vl(local_2e0,auVar95,2);
  uVar16 = vpcmpgtd_avx512vl(auVar94,_DAT_01fb4ba0);
  local_668 = CONCAT44((int)((ulong)in_R10 >> 0x20),(uint)(byte)((byte)uVar14 & (byte)uVar16));
  local_670 = prim;
LAB_01a37603:
  local_76c = 1;
  if (local_668 == 0) {
    return;
  }
  lVar78 = 0;
  for (uVar75 = local_668; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x8000000000000000) {
    lVar78 = lVar78 + 1;
  }
  local_910 = (ulong)*(uint *)(prim + 2);
  pGVar5 = (context->scene->geometries).items[*(uint *)(prim + 2)].ptr;
  local_908 = (ulong)*(uint *)(prim + lVar78 * 4 + 6);
  uVar75 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar78 * 4 + 6));
  p_Var6 = pGVar5[1].intersectionFilterN;
  lVar78 = *(long *)&pGVar5[1].time_range.upper;
  auVar84 = *(undefined1 (*) [16])(lVar78 + (long)p_Var6 * uVar75);
  auVar85 = *(undefined1 (*) [16])(lVar78 + (uVar75 + 1) * (long)p_Var6);
  local_668 = local_668 - 1 & local_668;
  if (local_668 != 0) {
    uVar77 = local_668 - 1 & local_668;
    for (uVar80 = local_668; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000) {
    }
    if (uVar77 != 0) {
      for (; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar217._0_4_ = auVar84._0_4_ + auVar85._0_4_;
  auVar217._4_4_ = auVar84._4_4_ + auVar85._4_4_;
  auVar217._8_4_ = auVar84._8_4_ + auVar85._8_4_;
  auVar217._12_4_ = auVar84._12_4_ + auVar85._12_4_;
  aVar1 = (ray->super_RayK<1>).org.field_0;
  aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar89._8_4_ = 0x3f000000;
  auVar89._0_8_ = 0x3f0000003f000000;
  auVar89._12_4_ = 0x3f000000;
  auVar82 = vmulps_avx512vl(auVar217,auVar89);
  auVar82 = vsubps_avx(auVar82,(undefined1  [16])aVar1);
  auVar82 = vdpps_avx(auVar82,(undefined1  [16])aVar2,0x7f);
  auVar86 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  auVar87 = ZEXT816(0) << 0x40;
  auVar242 = ZEXT1664(auVar87);
  auVar232._4_12_ = ZEXT812(0) << 0x20;
  auVar232._0_4_ = auVar86._0_4_;
  auVar83 = vrcp14ss_avx512f(auVar87,auVar232);
  auVar86 = vfnmadd213ss_fma(auVar83,auVar86,ZEXT416(0x40000000));
  fVar210 = auVar82._0_4_ * auVar83._0_4_ * auVar86._0_4_;
  local_570 = ZEXT416((uint)fVar210);
  auVar218._4_4_ = fVar210;
  auVar218._0_4_ = fVar210;
  auVar218._8_4_ = fVar210;
  auVar218._12_4_ = fVar210;
  fStack_470 = fVar210;
  _local_480 = auVar218;
  fStack_46c = fVar210;
  fStack_468 = fVar210;
  fStack_464 = fVar210;
  auVar82 = vfmadd231ps_fma((undefined1  [16])aVar1,(undefined1  [16])aVar2,auVar218);
  auVar82 = vblendps_avx(auVar82,auVar87,8);
  auVar84 = vsubps_avx(auVar84,auVar82);
  auVar86 = vsubps_avx(*(undefined1 (*) [16])(lVar78 + (uVar75 + 2) * (long)p_Var6),auVar82);
  uVar140 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
  local_420._4_4_ = uVar140;
  local_420._0_4_ = uVar140;
  local_420._8_4_ = uVar140;
  local_420._12_4_ = uVar140;
  local_420._16_4_ = uVar140;
  local_420._20_4_ = uVar140;
  local_420._24_4_ = uVar140;
  local_420._28_4_ = uVar140;
  auVar235 = ZEXT3264(local_420);
  uVar140 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
  local_440._4_4_ = uVar140;
  local_440._0_4_ = uVar140;
  local_440._8_4_ = uVar140;
  local_440._12_4_ = uVar140;
  local_440._16_4_ = uVar140;
  local_440._20_4_ = uVar140;
  local_440._24_4_ = uVar140;
  local_440._28_4_ = uVar140;
  local_4a0 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8);
  uStack_49c = local_4a0;
  uStack_498 = local_4a0;
  uStack_494 = local_4a0;
  uStack_490 = local_4a0;
  uStack_48c = local_4a0;
  uStack_488 = local_4a0;
  uStack_484 = local_4a0;
  auVar85 = vsubps_avx(auVar85,auVar82);
  auVar230 = ZEXT1664(auVar85);
  auVar82 = vsubps_avx(*(undefined1 (*) [16])(lVar78 + (uVar75 + 3) * (long)p_Var6),auVar82);
  local_800 = vbroadcastss_avx512vl(auVar84);
  auVar250 = ZEXT3264(local_800);
  auVar115._8_4_ = 1;
  auVar115._0_8_ = 0x100000001;
  auVar115._12_4_ = 1;
  auVar115._16_4_ = 1;
  auVar115._20_4_ = 1;
  auVar115._24_4_ = 1;
  auVar115._28_4_ = 1;
  local_5e0 = ZEXT1632(auVar84);
  local_820 = vpermps_avx512vl(auVar115,local_5e0);
  auVar251 = ZEXT3264(local_820);
  auVar118._8_4_ = 2;
  auVar118._0_8_ = 0x200000002;
  auVar118._12_4_ = 2;
  auVar118._16_4_ = 2;
  auVar118._20_4_ = 2;
  auVar118._24_4_ = 2;
  auVar118._28_4_ = 2;
  local_840 = vpermps_avx512vl(auVar118,local_5e0);
  auVar252 = ZEXT3264(local_840);
  auVar119._8_4_ = 3;
  auVar119._0_8_ = 0x300000003;
  auVar119._12_4_ = 3;
  auVar119._16_4_ = 3;
  auVar119._20_4_ = 3;
  auVar119._24_4_ = 3;
  auVar119._28_4_ = 3;
  local_860 = vpermps_avx512vl(auVar119,local_5e0);
  auVar253 = ZEXT3264(local_860);
  local_880 = vbroadcastss_avx512vl(auVar85);
  auVar254 = ZEXT3264(local_880);
  local_620 = ZEXT1632(auVar85);
  local_8a0 = vpermps_avx512vl(auVar115,local_620);
  auVar255 = ZEXT3264(local_8a0);
  local_8c0 = vpermps_avx512vl(auVar118,local_620);
  auVar256 = ZEXT3264(local_8c0);
  local_8e0 = vpermps_avx512vl(auVar119,local_620);
  auVar257 = ZEXT3264(local_8e0);
  local_740 = vbroadcastss_avx512vl(auVar86);
  auVar258 = ZEXT3264(local_740);
  local_600 = ZEXT1632(auVar86);
  local_760 = vpermps_avx512vl(auVar115,local_600);
  auVar259 = ZEXT3264(local_760);
  local_240 = vpermps_avx512vl(auVar118,local_600);
  local_1e0 = vpermps_avx2(auVar119,local_600);
  local_260 = vbroadcastss_avx512vl(auVar82);
  _local_640 = ZEXT1632(auVar82);
  local_220 = vpermps_avx512vl(auVar115,_local_640);
  local_2a0 = vpermps_avx2(auVar118,_local_640);
  local_2c0 = vpermps_avx2(auVar119,_local_640);
  auVar95 = vpermps_avx2(auVar118,ZEXT1632(CONCAT412(aVar2.field_3.w * aVar2.field_3.w,
                                                     CONCAT48(aVar2.z * aVar2.z,
                                                              CONCAT44(aVar2.y * aVar2.y,
                                                                       aVar2.x * aVar2.x)))));
  auVar84 = vfmadd231ps_fma(auVar95,local_440,local_440);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),local_420,local_420);
  local_200 = ZEXT1632(auVar84);
  auVar114._8_4_ = 0x7fffffff;
  auVar114._0_8_ = 0x7fffffff7fffffff;
  auVar114._12_4_ = 0x7fffffff;
  auVar114._16_4_ = 0x7fffffff;
  auVar114._20_4_ = 0x7fffffff;
  auVar114._24_4_ = 0x7fffffff;
  auVar114._28_4_ = 0x7fffffff;
  vandps_avx512vl(ZEXT1632(auVar84),auVar114);
  uVar75 = 0;
  local_3b0 = ZEXT816(0x3f80000000000000);
  auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar260 = ZEXT3264(auVar95);
  local_280 = local_220;
  do {
    auVar84 = vmovshdup_avx(local_3b0);
    auVar84 = vsubps_avx(auVar84,local_3b0);
    auVar141._0_4_ = auVar84._0_4_;
    fVar210 = auVar141._0_4_ * 0.04761905;
    uVar140 = local_3b0._0_4_;
    local_700._4_4_ = uVar140;
    local_700._0_4_ = uVar140;
    local_700._8_4_ = uVar140;
    local_700._12_4_ = uVar140;
    local_700._16_4_ = uVar140;
    local_700._20_4_ = uVar140;
    local_700._24_4_ = uVar140;
    local_700._28_4_ = uVar140;
    auVar141._4_4_ = auVar141._0_4_;
    auVar141._8_4_ = auVar141._0_4_;
    auVar141._12_4_ = auVar141._0_4_;
    local_720._16_4_ = auVar141._0_4_;
    local_720._0_16_ = auVar141;
    local_720._20_4_ = auVar141._0_4_;
    local_720._24_4_ = auVar141._0_4_;
    local_720._28_4_ = auVar141._0_4_;
    auVar84 = vfmadd231ps_fma(local_700,local_720,_DAT_01f7b040);
    auVar95 = vsubps_avx512vl(auVar260._0_32_,ZEXT1632(auVar84));
    fVar139 = auVar84._0_4_;
    fVar204 = auVar84._4_4_;
    fVar205 = auVar84._8_4_;
    fVar206 = auVar84._12_4_;
    fVar208 = auVar95._0_4_;
    fVar209 = auVar95._4_4_;
    fVar169 = auVar95._8_4_;
    fVar170 = auVar95._12_4_;
    fVar223 = auVar95._16_4_;
    fVar224 = auVar95._20_4_;
    fVar225 = auVar95._24_4_;
    auVar39._4_4_ = fVar209 * fVar209 * -fVar204;
    auVar39._0_4_ = fVar208 * fVar208 * -fVar139;
    auVar39._8_4_ = fVar169 * fVar169 * -fVar205;
    auVar39._12_4_ = fVar170 * fVar170 * -fVar206;
    auVar39._16_4_ = fVar223 * fVar223 * -0.0;
    auVar39._20_4_ = fVar224 * fVar224 * -0.0;
    auVar39._24_4_ = fVar225 * fVar225 * -0.0;
    auVar39._28_4_ = 0x80000000;
    auVar260._28_36_ = auVar230._28_36_;
    auVar260._0_28_ =
         ZEXT1628(CONCAT412(fVar206 * fVar206,
                            CONCAT48(fVar205 * fVar205,CONCAT44(fVar204 * fVar204,fVar139 * fVar139)
                                    )));
    fVar231 = fVar139 * 3.0;
    fVar237 = fVar204 * 3.0;
    fVar238 = fVar205 * 3.0;
    fVar239 = fVar206 * 3.0;
    auVar236._28_36_ = auVar235._28_36_;
    auVar236._0_28_ = ZEXT1628(CONCAT412(fVar239,CONCAT48(fVar238,CONCAT44(fVar237,fVar231))));
    auVar71._4_4_ = (fVar237 + -5.0) * fVar204 * fVar204;
    auVar71._0_4_ = (fVar231 + -5.0) * fVar139 * fVar139;
    auVar71._8_4_ = (fVar238 + -5.0) * fVar205 * fVar205;
    auVar71._12_4_ = (fVar239 + -5.0) * fVar206 * fVar206;
    auVar71._16_4_ = 0x80000000;
    auVar71._20_4_ = 0x80000000;
    auVar71._24_4_ = 0x80000000;
    auVar71._28_4_ = DAT_01f7b040._28_4_;
    auVar93 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
    auVar96 = vaddps_avx512vl(auVar71,auVar93);
    auVar243._0_4_ = fVar208 * fVar208;
    auVar243._4_4_ = fVar209 * fVar209;
    auVar243._8_4_ = fVar169 * fVar169;
    auVar243._12_4_ = fVar170 * fVar170;
    auVar243._16_4_ = fVar223 * fVar223;
    auVar243._20_4_ = fVar224 * fVar224;
    auVar243._28_36_ = auVar242._28_36_;
    auVar243._24_4_ = fVar225 * fVar225;
    auVar40._4_4_ = auVar243._4_4_ * (fVar209 * 3.0 + -5.0);
    auVar40._0_4_ = auVar243._0_4_ * (fVar208 * 3.0 + -5.0);
    auVar40._8_4_ = auVar243._8_4_ * (fVar169 * 3.0 + -5.0);
    auVar40._12_4_ = auVar243._12_4_ * (fVar170 * 3.0 + -5.0);
    auVar40._16_4_ = auVar243._16_4_ * (fVar223 * 3.0 + -5.0);
    auVar40._20_4_ = auVar243._20_4_ * (fVar224 * 3.0 + -5.0);
    auVar40._24_4_ = auVar243._24_4_ * (fVar225 * 3.0 + -5.0);
    auVar40._28_4_ = auVar246._28_4_ + -5.0;
    auVar97 = vaddps_avx512vl(auVar40,auVar93);
    fVar207 = auVar95._28_4_;
    auVar41._4_4_ = fVar204 * fVar204 * -fVar209;
    auVar41._0_4_ = fVar139 * fVar139 * -fVar208;
    auVar41._8_4_ = fVar205 * fVar205 * -fVar169;
    auVar41._12_4_ = fVar206 * fVar206 * -fVar170;
    auVar41._16_4_ = -fVar223 * 0.0 * 0.0;
    auVar41._20_4_ = -fVar224 * 0.0 * 0.0;
    auVar41._24_4_ = -fVar225 * 0.0 * 0.0;
    auVar41._28_4_ = -fVar207;
    auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar95 = vmulps_avx512vl(auVar39,auVar98);
    auVar94 = vmulps_avx512vl(auVar96,auVar98);
    auVar96 = vmulps_avx512vl(auVar97,auVar98);
    auVar97 = vmulps_avx512vl(auVar41,auVar98);
    auVar99 = vmulps_avx512vl(local_260,auVar97);
    auVar100 = vmulps_avx512vl(local_280,auVar97);
    auVar42._4_4_ = local_2a0._4_4_ * auVar97._4_4_;
    auVar42._0_4_ = local_2a0._0_4_ * auVar97._0_4_;
    auVar42._8_4_ = local_2a0._8_4_ * auVar97._8_4_;
    auVar42._12_4_ = local_2a0._12_4_ * auVar97._12_4_;
    auVar42._16_4_ = local_2a0._16_4_ * auVar97._16_4_;
    auVar42._20_4_ = local_2a0._20_4_ * auVar97._20_4_;
    auVar42._24_4_ = local_2a0._24_4_ * auVar97._24_4_;
    auVar42._28_4_ = 0x80000000;
    auVar43._4_4_ = local_2c0._4_4_ * auVar97._4_4_;
    auVar43._0_4_ = local_2c0._0_4_ * auVar97._0_4_;
    auVar43._8_4_ = local_2c0._8_4_ * auVar97._8_4_;
    auVar43._12_4_ = local_2c0._12_4_ * auVar97._12_4_;
    auVar43._16_4_ = local_2c0._16_4_ * auVar97._16_4_;
    auVar43._20_4_ = local_2c0._20_4_ * auVar97._20_4_;
    auVar43._24_4_ = local_2c0._24_4_ * auVar97._24_4_;
    auVar43._28_4_ = auVar97._28_4_;
    auVar97 = vfmadd231ps_avx512vl(auVar99,auVar96,auVar258._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar100,auVar96,auVar259._0_32_);
    auVar100 = vfmadd231ps_avx512vl(auVar42,auVar96,local_240);
    auVar96 = vfmadd231ps_avx512vl(auVar43,local_1e0,auVar96);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar94,auVar254._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar94,auVar255._0_32_);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar94,auVar256._0_32_);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar257._0_32_,auVar94);
    auVar101 = vfmadd231ps_avx512vl(auVar97,auVar95,auVar250._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar95,auVar251._0_32_);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar95,auVar252._0_32_);
    auVar97 = vfmadd231ps_avx512vl(auVar96,auVar253._0_32_,auVar95);
    auVar44._4_4_ = (fVar209 + fVar209) * fVar204;
    auVar44._0_4_ = (fVar208 + fVar208) * fVar139;
    auVar44._8_4_ = (fVar169 + fVar169) * fVar205;
    auVar44._12_4_ = (fVar170 + fVar170) * fVar206;
    auVar44._16_4_ = (fVar223 + fVar223) * 0.0;
    auVar44._20_4_ = (fVar224 + fVar224) * 0.0;
    auVar44._24_4_ = (fVar225 + fVar225) * 0.0;
    auVar44._28_4_ = auVar94._28_4_;
    auVar95 = vsubps_avx(auVar44,auVar243._0_32_);
    auVar215._0_28_ =
         ZEXT1628(CONCAT412((fVar206 + fVar206) * (fVar239 + -5.0) + fVar239 * fVar206,
                            CONCAT48((fVar205 + fVar205) * (fVar238 + -5.0) + fVar238 * fVar205,
                                     CONCAT44((fVar204 + fVar204) * (fVar237 + -5.0) +
                                              fVar237 * fVar204,
                                              (fVar139 + fVar139) * (fVar231 + -5.0) +
                                              fVar231 * fVar139))));
    auVar215._28_4_ = auVar235._28_4_ + -5.0 + 0.0;
    auVar93 = vaddps_avx512vl(auVar236._0_32_,auVar93);
    auVar45._4_4_ = (fVar209 + fVar209) * auVar93._4_4_;
    auVar45._0_4_ = (fVar208 + fVar208) * auVar93._0_4_;
    auVar45._8_4_ = (fVar169 + fVar169) * auVar93._8_4_;
    auVar45._12_4_ = (fVar170 + fVar170) * auVar93._12_4_;
    auVar45._16_4_ = (fVar223 + fVar223) * auVar93._16_4_;
    auVar45._20_4_ = (fVar224 + fVar224) * auVar93._20_4_;
    auVar45._24_4_ = (fVar225 + fVar225) * auVar93._24_4_;
    auVar45._28_4_ = auVar93._28_4_;
    auVar46._4_4_ = fVar209 * 3.0 * fVar209;
    auVar46._0_4_ = fVar208 * 3.0 * fVar208;
    auVar46._8_4_ = fVar169 * 3.0 * fVar169;
    auVar46._12_4_ = fVar170 * 3.0 * fVar170;
    auVar46._16_4_ = fVar223 * 3.0 * fVar223;
    auVar46._20_4_ = fVar224 * 3.0 * fVar224;
    auVar46._24_4_ = fVar225 * 3.0 * fVar225;
    auVar46._28_4_ = fVar207;
    auVar93 = vsubps_avx(auVar45,auVar46);
    auVar96 = vsubps_avx(auVar260._0_32_,auVar44);
    auVar95 = vmulps_avx512vl(auVar95,auVar98);
    auVar102 = vmulps_avx512vl(auVar215,auVar98);
    auVar93 = vmulps_avx512vl(auVar93,auVar98);
    auVar96 = vmulps_avx512vl(auVar96,auVar98);
    auVar98 = vmulps_avx512vl(local_260,auVar96);
    auVar103 = vmulps_avx512vl(local_280,auVar96);
    auVar47._4_4_ = local_2a0._4_4_ * auVar96._4_4_;
    auVar47._0_4_ = local_2a0._0_4_ * auVar96._0_4_;
    auVar47._8_4_ = local_2a0._8_4_ * auVar96._8_4_;
    auVar47._12_4_ = local_2a0._12_4_ * auVar96._12_4_;
    auVar47._16_4_ = local_2a0._16_4_ * auVar96._16_4_;
    auVar47._20_4_ = local_2a0._20_4_ * auVar96._20_4_;
    auVar47._24_4_ = local_2a0._24_4_ * auVar96._24_4_;
    auVar47._28_4_ = auVar94._28_4_;
    auVar48._4_4_ = local_2c0._4_4_ * auVar96._4_4_;
    auVar48._0_4_ = local_2c0._0_4_ * auVar96._0_4_;
    auVar48._8_4_ = local_2c0._8_4_ * auVar96._8_4_;
    auVar48._12_4_ = local_2c0._12_4_ * auVar96._12_4_;
    auVar48._16_4_ = local_2c0._16_4_ * auVar96._16_4_;
    auVar48._20_4_ = local_2c0._20_4_ * auVar96._20_4_;
    auVar48._24_4_ = local_2c0._24_4_ * auVar96._24_4_;
    auVar48._28_4_ = auVar96._28_4_;
    auVar96 = vfmadd231ps_avx512vl(auVar98,auVar93,auVar258._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar103,auVar93,auVar259._0_32_);
    auVar94 = vfmadd231ps_avx512vl(auVar47,auVar93,local_240);
    auVar93 = vfmadd231ps_avx512vl(auVar48,local_1e0,auVar93);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar102,auVar254._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar102,auVar255._0_32_);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar102,auVar256._0_32_);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar257._0_32_,auVar102);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar95,auVar250._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar95,auVar251._0_32_);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar95,auVar252._0_32_);
    auVar95 = vfmadd231ps_avx512vl(auVar93,auVar253._0_32_,auVar95);
    auVar49._4_4_ = auVar96._4_4_ * fVar210;
    auVar49._0_4_ = auVar96._0_4_ * fVar210;
    auVar49._8_4_ = auVar96._8_4_ * fVar210;
    auVar49._12_4_ = auVar96._12_4_ * fVar210;
    auVar49._16_4_ = auVar96._16_4_ * fVar210;
    auVar49._20_4_ = auVar96._20_4_ * fVar210;
    auVar49._24_4_ = auVar96._24_4_ * fVar210;
    auVar49._28_4_ = auVar246._28_4_;
    auVar246 = ZEXT3264(auVar49);
    auVar50._4_4_ = auVar98._4_4_ * fVar210;
    auVar50._0_4_ = auVar98._0_4_ * fVar210;
    auVar50._8_4_ = auVar98._8_4_ * fVar210;
    auVar50._12_4_ = auVar98._12_4_ * fVar210;
    auVar50._16_4_ = auVar98._16_4_ * fVar210;
    auVar50._20_4_ = auVar98._20_4_ * fVar210;
    auVar50._24_4_ = auVar98._24_4_ * fVar210;
    auVar50._28_4_ = fVar207 + fVar207;
    auVar51._4_4_ = auVar94._4_4_ * fVar210;
    auVar51._0_4_ = auVar94._0_4_ * fVar210;
    auVar51._8_4_ = auVar94._8_4_ * fVar210;
    auVar51._12_4_ = auVar94._12_4_ * fVar210;
    auVar51._16_4_ = auVar94._16_4_ * fVar210;
    auVar51._20_4_ = auVar94._20_4_ * fVar210;
    auVar51._24_4_ = auVar94._24_4_ * fVar210;
    auVar51._28_4_ = auVar94._28_4_;
    fVar139 = fVar210 * auVar95._0_4_;
    fVar204 = fVar210 * auVar95._4_4_;
    auVar52._4_4_ = fVar204;
    auVar52._0_4_ = fVar139;
    fVar205 = fVar210 * auVar95._8_4_;
    auVar52._8_4_ = fVar205;
    fVar206 = fVar210 * auVar95._12_4_;
    auVar52._12_4_ = fVar206;
    fVar207 = fVar210 * auVar95._16_4_;
    auVar52._16_4_ = fVar207;
    fVar208 = fVar210 * auVar95._20_4_;
    auVar52._20_4_ = fVar208;
    fVar209 = fVar210 * auVar95._24_4_;
    auVar52._24_4_ = fVar209;
    auVar52._28_4_ = fVar210;
    auVar84 = vxorps_avx512vl(local_1e0._0_16_,local_1e0._0_16_);
    local_900 = vpermt2ps_avx512vl(auVar101,_DAT_01fb9fc0,ZEXT1632(auVar84));
    auVar102 = vpermt2ps_avx512vl(auVar99,_DAT_01fb9fc0,ZEXT1632(auVar84));
    auVar96 = ZEXT1632(auVar84);
    auVar103 = vpermt2ps_avx512vl(auVar100,_DAT_01fb9fc0,auVar96);
    auVar242 = ZEXT3264(auVar103);
    auVar216._0_4_ = auVar97._0_4_ + fVar139;
    auVar216._4_4_ = auVar97._4_4_ + fVar204;
    auVar216._8_4_ = auVar97._8_4_ + fVar205;
    auVar216._12_4_ = auVar97._12_4_ + fVar206;
    auVar216._16_4_ = auVar97._16_4_ + fVar207;
    auVar216._20_4_ = auVar97._20_4_ + fVar208;
    auVar216._24_4_ = auVar97._24_4_ + fVar209;
    auVar216._28_4_ = auVar97._28_4_ + fVar210;
    auVar95 = vmaxps_avx(auVar97,auVar216);
    auVar93 = vminps_avx(auVar97,auVar216);
    auVar92 = vpermt2ps_avx512vl(auVar97,_DAT_01fb9fc0,auVar96);
    auVar90 = vpermt2ps_avx512vl(auVar49,_DAT_01fb9fc0,auVar96);
    auVar91 = vpermt2ps_avx512vl(auVar50,_DAT_01fb9fc0,auVar96);
    auVar114 = ZEXT1632(auVar84);
    auVar104 = vpermt2ps_avx512vl(auVar51,_DAT_01fb9fc0,auVar114);
    auVar96 = vpermt2ps_avx512vl(auVar52,_DAT_01fb9fc0,auVar114);
    auVar96 = vsubps_avx(auVar92,auVar96);
    auVar97 = vsubps_avx(local_900,auVar101);
    auVar230 = ZEXT3264(auVar97);
    auVar98 = vsubps_avx(auVar102,auVar99);
    auVar94 = vsubps_avx(auVar103,auVar100);
    auVar105 = vmulps_avx512vl(auVar98,auVar51);
    auVar105 = vfmsub231ps_avx512vl(auVar105,auVar50,auVar94);
    auVar106 = vmulps_avx512vl(auVar94,auVar49);
    auVar106 = vfmsub231ps_avx512vl(auVar106,auVar51,auVar97);
    auVar107 = vmulps_avx512vl(auVar97,auVar50);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar49,auVar98);
    auVar107 = vmulps_avx512vl(auVar107,auVar107);
    auVar106 = vfmadd231ps_avx512vl(auVar107,auVar106,auVar106);
    auVar105 = vfmadd231ps_avx512vl(auVar106,auVar105,auVar105);
    auVar106 = vmulps_avx512vl(auVar94,auVar94);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar98,auVar98);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar97,auVar97);
    auVar107 = vrcp14ps_avx512vl(auVar106);
    auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar235 = ZEXT3264(auVar108);
    auVar109 = vfnmadd213ps_avx512vl(auVar107,auVar106,auVar108);
    auVar107 = vfmadd132ps_avx512vl(auVar109,auVar107,auVar107);
    auVar105 = vmulps_avx512vl(auVar105,auVar107);
    auVar109 = vmulps_avx512vl(auVar98,auVar104);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar91,auVar94);
    auVar110 = vmulps_avx512vl(auVar94,auVar90);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar104,auVar97);
    auVar111 = vmulps_avx512vl(auVar97,auVar91);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar90,auVar98);
    auVar111 = vmulps_avx512vl(auVar111,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar111,auVar110,auVar110);
    auVar109 = vfmadd231ps_avx512vl(auVar110,auVar109,auVar109);
    auVar107 = vmulps_avx512vl(auVar109,auVar107);
    auVar105 = vmaxps_avx512vl(auVar105,auVar107);
    auVar105 = vsqrtps_avx512vl(auVar105);
    auVar107 = vmaxps_avx512vl(auVar96,auVar92);
    auVar95 = vmaxps_avx512vl(auVar95,auVar107);
    auVar107 = vaddps_avx512vl(auVar105,auVar95);
    auVar95 = vminps_avx(auVar96,auVar92);
    auVar95 = vminps_avx(auVar93,auVar95);
    auVar95 = vsubps_avx512vl(auVar95,auVar105);
    auVar120._8_4_ = 0x3f800002;
    auVar120._0_8_ = 0x3f8000023f800002;
    auVar120._12_4_ = 0x3f800002;
    auVar120._16_4_ = 0x3f800002;
    auVar120._20_4_ = 0x3f800002;
    auVar120._24_4_ = 0x3f800002;
    auVar120._28_4_ = 0x3f800002;
    auVar93 = vmulps_avx512vl(auVar107,auVar120);
    auVar26._8_4_ = 0x3f7ffffc;
    auVar26._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar26._12_4_ = 0x3f7ffffc;
    auVar26._16_4_ = 0x3f7ffffc;
    auVar26._20_4_ = 0x3f7ffffc;
    auVar26._24_4_ = 0x3f7ffffc;
    auVar26._28_4_ = 0x3f7ffffc;
    local_5a0 = vmulps_avx512vl(auVar95,auVar26);
    auVar95 = vmulps_avx512vl(auVar93,auVar93);
    auVar93 = vrsqrt14ps_avx512vl(auVar106);
    auVar27._8_4_ = 0xbf000000;
    auVar27._0_8_ = 0xbf000000bf000000;
    auVar27._12_4_ = 0xbf000000;
    auVar27._16_4_ = 0xbf000000;
    auVar27._20_4_ = 0xbf000000;
    auVar27._24_4_ = 0xbf000000;
    auVar27._28_4_ = 0xbf000000;
    auVar96 = vmulps_avx512vl(auVar106,auVar27);
    fVar210 = auVar93._0_4_;
    fVar139 = auVar93._4_4_;
    fVar204 = auVar93._8_4_;
    fVar205 = auVar93._12_4_;
    fVar206 = auVar93._16_4_;
    fVar207 = auVar93._20_4_;
    fVar208 = auVar93._24_4_;
    auVar53._4_4_ = fVar139 * fVar139 * fVar139 * auVar96._4_4_;
    auVar53._0_4_ = fVar210 * fVar210 * fVar210 * auVar96._0_4_;
    auVar53._8_4_ = fVar204 * fVar204 * fVar204 * auVar96._8_4_;
    auVar53._12_4_ = fVar205 * fVar205 * fVar205 * auVar96._12_4_;
    auVar53._16_4_ = fVar206 * fVar206 * fVar206 * auVar96._16_4_;
    auVar53._20_4_ = fVar207 * fVar207 * fVar207 * auVar96._20_4_;
    auVar53._24_4_ = fVar208 * fVar208 * fVar208 * auVar96._24_4_;
    auVar53._28_4_ = auVar107._28_4_;
    auVar28._8_4_ = 0x3fc00000;
    auVar28._0_8_ = 0x3fc000003fc00000;
    auVar28._12_4_ = 0x3fc00000;
    auVar28._16_4_ = 0x3fc00000;
    auVar28._20_4_ = 0x3fc00000;
    auVar28._24_4_ = 0x3fc00000;
    auVar28._28_4_ = 0x3fc00000;
    auVar93 = vfmadd231ps_avx512vl(auVar53,auVar93,auVar28);
    auVar96 = vmulps_avx512vl(auVar97,auVar93);
    auVar92 = vmulps_avx512vl(auVar98,auVar93);
    auVar105 = vmulps_avx512vl(auVar94,auVar93);
    auVar106 = vsubps_avx512vl(auVar114,auVar101);
    auVar107 = vsubps_avx512vl(auVar114,auVar99);
    auVar109 = vsubps_avx512vl(auVar114,auVar100);
    auVar68._4_4_ = uStack_49c;
    auVar68._0_4_ = local_4a0;
    auVar68._8_4_ = uStack_498;
    auVar68._12_4_ = uStack_494;
    auVar68._16_4_ = uStack_490;
    auVar68._20_4_ = uStack_48c;
    auVar68._24_4_ = uStack_488;
    auVar68._28_4_ = uStack_484;
    auVar110 = vmulps_avx512vl(auVar68,auVar109);
    auVar110 = vfmadd231ps_avx512vl(auVar110,local_440,auVar107);
    auVar110 = vfmadd231ps_avx512vl(auVar110,local_420,auVar106);
    auVar111 = vmulps_avx512vl(auVar109,auVar109);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar107,auVar107);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar106,auVar106);
    auVar112 = vmulps_avx512vl(auVar68,auVar105);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar92,local_440);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar96,local_420);
    auVar105 = vmulps_avx512vl(auVar109,auVar105);
    auVar92 = vfmadd231ps_avx512vl(auVar105,auVar107,auVar92);
    auVar96 = vfmadd231ps_avx512vl(auVar92,auVar106,auVar96);
    auVar92 = vmulps_avx512vl(auVar112,auVar112);
    auVar105 = vsubps_avx512vl(local_200,auVar92);
    auVar113 = vmulps_avx512vl(auVar112,auVar96);
    auVar110 = vsubps_avx512vl(auVar110,auVar113);
    auVar110 = vaddps_avx512vl(auVar110,auVar110);
    auVar113 = vmulps_avx512vl(auVar96,auVar96);
    local_5c0 = vsubps_avx512vl(auVar111,auVar113);
    auVar95 = vsubps_avx512vl(local_5c0,auVar95);
    local_6c0 = vmulps_avx512vl(auVar110,auVar110);
    auVar29._8_4_ = 0x40800000;
    auVar29._0_8_ = 0x4080000040800000;
    auVar29._12_4_ = 0x40800000;
    auVar29._16_4_ = 0x40800000;
    auVar29._20_4_ = 0x40800000;
    auVar29._24_4_ = 0x40800000;
    auVar29._28_4_ = 0x40800000;
    _local_4c0 = vmulps_avx512vl(auVar105,auVar29);
    auVar111 = vmulps_avx512vl(_local_4c0,auVar95);
    auVar111 = vsubps_avx512vl(local_6c0,auVar111);
    uVar80 = vcmpps_avx512vl(auVar111,auVar114,5);
    bVar72 = (byte)uVar80;
    if (bVar72 == 0) {
      auVar260 = ZEXT3264(auVar108);
LAB_01a382cb:
      auVar250 = ZEXT3264(local_800);
      auVar251 = ZEXT3264(local_820);
      auVar252 = ZEXT3264(local_840);
      auVar253 = ZEXT3264(local_860);
      auVar254 = ZEXT3264(local_880);
      auVar255 = ZEXT3264(local_8a0);
      auVar256 = ZEXT3264(local_8c0);
      auVar257 = ZEXT3264(local_8e0);
      auVar258 = ZEXT3264(local_740);
      auVar259 = ZEXT3264(local_760);
    }
    else {
      auVar113 = _local_4c0;
      auVar111 = vsqrtps_avx512vl(auVar111);
      auVar114 = vaddps_avx512vl(auVar105,auVar105);
      local_6e0 = vrcp14ps_avx512vl(auVar114);
      auVar108 = vfnmadd213ps_avx512vl(local_6e0,auVar114,auVar108);
      auVar108 = vfmadd132ps_avx512vl(auVar108,local_6e0,local_6e0);
      auVar30._8_4_ = 0x80000000;
      auVar30._0_8_ = 0x8000000080000000;
      auVar30._12_4_ = 0x80000000;
      auVar30._16_4_ = 0x80000000;
      auVar30._20_4_ = 0x80000000;
      auVar30._24_4_ = 0x80000000;
      auVar30._28_4_ = 0x80000000;
      local_4e0 = vxorps_avx512vl(auVar110,auVar30);
      auVar115 = vsubps_avx512vl(local_4e0,auVar111);
      auVar115 = vmulps_avx512vl(auVar115,auVar108);
      auVar111 = vsubps_avx512vl(auVar111,auVar110);
      local_500 = vmulps_avx512vl(auVar111,auVar108);
      auVar111 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar111 = vblendmps_avx512vl(auVar111,auVar115);
      auVar116._0_4_ =
           (uint)(bVar72 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar108._0_4_;
      bVar79 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar116._4_4_ = (uint)bVar79 * auVar111._4_4_ | (uint)!bVar79 * auVar108._4_4_;
      bVar79 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar116._8_4_ = (uint)bVar79 * auVar111._8_4_ | (uint)!bVar79 * auVar108._8_4_;
      bVar79 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar116._12_4_ = (uint)bVar79 * auVar111._12_4_ | (uint)!bVar79 * auVar108._12_4_;
      bVar79 = (bool)((byte)(uVar80 >> 4) & 1);
      auVar116._16_4_ = (uint)bVar79 * auVar111._16_4_ | (uint)!bVar79 * auVar108._16_4_;
      bVar79 = (bool)((byte)(uVar80 >> 5) & 1);
      auVar116._20_4_ = (uint)bVar79 * auVar111._20_4_ | (uint)!bVar79 * auVar108._20_4_;
      bVar79 = (bool)((byte)(uVar80 >> 6) & 1);
      auVar116._24_4_ = (uint)bVar79 * auVar111._24_4_ | (uint)!bVar79 * auVar108._24_4_;
      bVar79 = SUB81(uVar80 >> 7,0);
      auVar116._28_4_ = (uint)bVar79 * auVar111._28_4_ | (uint)!bVar79 * auVar108._28_4_;
      auVar108 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar111 = vblendmps_avx512vl(auVar108,local_500);
      auVar117._0_4_ =
           (uint)(bVar72 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar108._0_4_;
      bVar79 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar117._4_4_ = (uint)bVar79 * auVar111._4_4_ | (uint)!bVar79 * auVar108._4_4_;
      bVar79 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar117._8_4_ = (uint)bVar79 * auVar111._8_4_ | (uint)!bVar79 * auVar108._8_4_;
      bVar79 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar117._12_4_ = (uint)bVar79 * auVar111._12_4_ | (uint)!bVar79 * auVar108._12_4_;
      bVar79 = (bool)((byte)(uVar80 >> 4) & 1);
      auVar117._16_4_ = (uint)bVar79 * auVar111._16_4_ | (uint)!bVar79 * auVar108._16_4_;
      bVar79 = (bool)((byte)(uVar80 >> 5) & 1);
      auVar117._20_4_ = (uint)bVar79 * auVar111._20_4_ | (uint)!bVar79 * auVar108._20_4_;
      bVar79 = (bool)((byte)(uVar80 >> 6) & 1);
      auVar117._24_4_ = (uint)bVar79 * auVar111._24_4_ | (uint)!bVar79 * auVar108._24_4_;
      bVar79 = SUB81(uVar80 >> 7,0);
      auVar117._28_4_ = (uint)bVar79 * auVar111._28_4_ | (uint)!bVar79 * auVar108._28_4_;
      auVar108 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar92,auVar108);
      local_520 = vmaxps_avx512vl(local_220,auVar108);
      auVar235 = ZEXT3264(local_520);
      auVar31._8_4_ = 0x36000000;
      auVar31._0_8_ = 0x3600000036000000;
      auVar31._12_4_ = 0x36000000;
      auVar31._16_4_ = 0x36000000;
      auVar31._20_4_ = 0x36000000;
      auVar31._24_4_ = 0x36000000;
      auVar31._28_4_ = 0x36000000;
      local_660 = vmulps_avx512vl(local_520,auVar31);
      vandps_avx512vl(auVar105,auVar108);
      uVar77 = vcmpps_avx512vl(local_660,local_660,1);
      uVar80 = uVar80 & uVar77;
      bVar76 = (byte)uVar80;
      if (bVar76 != 0) {
        uVar77 = vcmpps_avx512vl(auVar95,_DAT_01f7b000,2);
        auVar95 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar92 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar105 = vblendmps_avx512vl(auVar95,auVar92);
        bVar74 = (byte)uVar77;
        uVar81 = (uint)(bVar74 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar74 & 1) * local_660._0_4_;
        bVar79 = (bool)((byte)(uVar77 >> 1) & 1);
        uVar132 = (uint)bVar79 * auVar105._4_4_ | (uint)!bVar79 * local_660._4_4_;
        bVar79 = (bool)((byte)(uVar77 >> 2) & 1);
        uVar133 = (uint)bVar79 * auVar105._8_4_ | (uint)!bVar79 * local_660._8_4_;
        bVar79 = (bool)((byte)(uVar77 >> 3) & 1);
        uVar134 = (uint)bVar79 * auVar105._12_4_ | (uint)!bVar79 * local_660._12_4_;
        bVar79 = (bool)((byte)(uVar77 >> 4) & 1);
        uVar135 = (uint)bVar79 * auVar105._16_4_ | (uint)!bVar79 * local_660._16_4_;
        bVar79 = (bool)((byte)(uVar77 >> 5) & 1);
        uVar136 = (uint)bVar79 * auVar105._20_4_ | (uint)!bVar79 * local_660._20_4_;
        bVar79 = (bool)((byte)(uVar77 >> 6) & 1);
        uVar137 = (uint)bVar79 * auVar105._24_4_ | (uint)!bVar79 * local_660._24_4_;
        bVar79 = SUB81(uVar77 >> 7,0);
        uVar138 = (uint)bVar79 * auVar105._28_4_ | (uint)!bVar79 * local_660._28_4_;
        auVar116._0_4_ = (bVar76 & 1) * uVar81 | !(bool)(bVar76 & 1) * auVar116._0_4_;
        bVar79 = (bool)((byte)(uVar80 >> 1) & 1);
        auVar116._4_4_ = bVar79 * uVar132 | !bVar79 * auVar116._4_4_;
        bVar79 = (bool)((byte)(uVar80 >> 2) & 1);
        auVar116._8_4_ = bVar79 * uVar133 | !bVar79 * auVar116._8_4_;
        bVar79 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar116._12_4_ = bVar79 * uVar134 | !bVar79 * auVar116._12_4_;
        bVar79 = (bool)((byte)(uVar80 >> 4) & 1);
        auVar116._16_4_ = bVar79 * uVar135 | !bVar79 * auVar116._16_4_;
        bVar79 = (bool)((byte)(uVar80 >> 5) & 1);
        auVar116._20_4_ = bVar79 * uVar136 | !bVar79 * auVar116._20_4_;
        bVar79 = (bool)((byte)(uVar80 >> 6) & 1);
        auVar116._24_4_ = bVar79 * uVar137 | !bVar79 * auVar116._24_4_;
        bVar79 = SUB81(uVar80 >> 7,0);
        auVar116._28_4_ = bVar79 * uVar138 | !bVar79 * auVar116._28_4_;
        auVar95 = vblendmps_avx512vl(auVar92,auVar95);
        bVar79 = (bool)((byte)(uVar77 >> 1) & 1);
        bVar8 = (bool)((byte)(uVar77 >> 2) & 1);
        bVar9 = (bool)((byte)(uVar77 >> 3) & 1);
        bVar10 = (bool)((byte)(uVar77 >> 4) & 1);
        bVar11 = (bool)((byte)(uVar77 >> 5) & 1);
        bVar12 = (bool)((byte)(uVar77 >> 6) & 1);
        bVar13 = SUB81(uVar77 >> 7,0);
        auVar117._0_4_ =
             (uint)(bVar76 & 1) *
             ((uint)(bVar74 & 1) * auVar95._0_4_ | !(bool)(bVar74 & 1) * uVar81) |
             !(bool)(bVar76 & 1) * auVar117._0_4_;
        bVar7 = (bool)((byte)(uVar80 >> 1) & 1);
        auVar117._4_4_ =
             (uint)bVar7 * ((uint)bVar79 * auVar95._4_4_ | !bVar79 * uVar132) |
             !bVar7 * auVar117._4_4_;
        bVar79 = (bool)((byte)(uVar80 >> 2) & 1);
        auVar117._8_4_ =
             (uint)bVar79 * ((uint)bVar8 * auVar95._8_4_ | !bVar8 * uVar133) |
             !bVar79 * auVar117._8_4_;
        bVar79 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar117._12_4_ =
             (uint)bVar79 * ((uint)bVar9 * auVar95._12_4_ | !bVar9 * uVar134) |
             !bVar79 * auVar117._12_4_;
        bVar79 = (bool)((byte)(uVar80 >> 4) & 1);
        auVar117._16_4_ =
             (uint)bVar79 * ((uint)bVar10 * auVar95._16_4_ | !bVar10 * uVar135) |
             !bVar79 * auVar117._16_4_;
        bVar79 = (bool)((byte)(uVar80 >> 5) & 1);
        auVar117._20_4_ =
             (uint)bVar79 * ((uint)bVar11 * auVar95._20_4_ | !bVar11 * uVar136) |
             !bVar79 * auVar117._20_4_;
        bVar79 = (bool)((byte)(uVar80 >> 6) & 1);
        auVar117._24_4_ =
             (uint)bVar79 * ((uint)bVar12 * auVar95._24_4_ | !bVar12 * uVar137) |
             !bVar79 * auVar117._24_4_;
        bVar79 = SUB81(uVar80 >> 7,0);
        auVar117._28_4_ =
             (uint)bVar79 * ((uint)bVar13 * auVar95._28_4_ | !bVar13 * uVar138) |
             !bVar79 * auVar117._28_4_;
        bVar72 = (~bVar76 | bVar74) & bVar72;
      }
      auVar69._4_4_ = uStack_49c;
      auVar69._0_4_ = local_4a0;
      auVar69._8_4_ = uStack_498;
      auVar69._12_4_ = uStack_494;
      auVar69._16_4_ = uStack_490;
      auVar69._20_4_ = uStack_48c;
      auVar69._24_4_ = uStack_488;
      auVar69._28_4_ = uStack_484;
      if ((bVar72 & 0x7f) == 0) {
        auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar260 = ZEXT3264(auVar95);
        goto LAB_01a382cb;
      }
      auVar92 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar104 = vxorps_avx512vl(auVar104,auVar92);
      auVar90 = vxorps_avx512vl(auVar90,auVar92);
      auVar91 = vxorps_avx512vl(auVar91,auVar92);
      auVar84 = vsubss_avx512f(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]),local_570);
      auVar95 = vbroadcastss_avx512vl(auVar84);
      auVar105 = vmaxps_avx512vl(auVar95,auVar116);
      auVar84 = vsubss_avx512f(ZEXT416((uint)(ray->super_RayK<1>).tfar),local_570);
      auVar95 = vbroadcastss_avx512vl(auVar84);
      auVar108 = vminps_avx512vl(auVar95,auVar117);
      auVar95 = vmulps_avx512vl(auVar109,auVar51);
      auVar95 = vfmadd213ps_avx512vl(auVar107,auVar50,auVar95);
      auVar84 = vfmadd213ps_fma(auVar106,auVar49,auVar95);
      auVar95 = vmulps_avx512vl(auVar69,auVar51);
      auVar95 = vfmadd231ps_avx512vl(auVar95,local_440,auVar50);
      auVar106 = vfmadd231ps_avx512vl(auVar95,local_420,auVar49);
      auVar244._8_4_ = 0x7fffffff;
      auVar244._0_8_ = 0x7fffffff7fffffff;
      auVar244._12_4_ = 0x7fffffff;
      auVar244._16_4_ = 0x7fffffff;
      auVar244._20_4_ = 0x7fffffff;
      auVar244._24_4_ = 0x7fffffff;
      auVar244._28_4_ = 0x7fffffff;
      auVar95 = vandps_avx(auVar244,auVar106);
      auVar107 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar14 = vcmpps_avx512vl(auVar95,auVar107,1);
      auVar95 = vxorps_avx512vl(ZEXT1632(auVar84),auVar92);
      auVar109 = vrcp14ps_avx512vl(auVar106);
      auVar111 = vxorps_avx512vl(auVar106,auVar92);
      auVar118 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar119 = vfnmadd213ps_avx512vl(auVar109,auVar106,auVar118);
      auVar84 = vfmadd132ps_fma(auVar119,auVar109,auVar109);
      fVar210 = auVar84._0_4_ * auVar95._0_4_;
      fVar139 = auVar84._4_4_ * auVar95._4_4_;
      auVar54._4_4_ = fVar139;
      auVar54._0_4_ = fVar210;
      fVar204 = auVar84._8_4_ * auVar95._8_4_;
      auVar54._8_4_ = fVar204;
      fVar205 = auVar84._12_4_ * auVar95._12_4_;
      auVar54._12_4_ = fVar205;
      fVar206 = auVar95._16_4_ * 0.0;
      auVar54._16_4_ = fVar206;
      fVar207 = auVar95._20_4_ * 0.0;
      auVar54._20_4_ = fVar207;
      fVar208 = auVar95._24_4_ * 0.0;
      auVar54._24_4_ = fVar208;
      auVar54._28_4_ = auVar95._28_4_;
      uVar16 = vcmpps_avx512vl(auVar106,auVar111,1);
      bVar76 = (byte)uVar14 | (byte)uVar16;
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar120 = vblendmps_avx512vl(auVar54,auVar119);
      auVar121._0_4_ =
           (uint)(bVar76 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar109._0_4_;
      bVar79 = (bool)(bVar76 >> 1 & 1);
      auVar121._4_4_ = (uint)bVar79 * auVar120._4_4_ | (uint)!bVar79 * auVar109._4_4_;
      bVar79 = (bool)(bVar76 >> 2 & 1);
      auVar121._8_4_ = (uint)bVar79 * auVar120._8_4_ | (uint)!bVar79 * auVar109._8_4_;
      bVar79 = (bool)(bVar76 >> 3 & 1);
      auVar121._12_4_ = (uint)bVar79 * auVar120._12_4_ | (uint)!bVar79 * auVar109._12_4_;
      bVar79 = (bool)(bVar76 >> 4 & 1);
      auVar121._16_4_ = (uint)bVar79 * auVar120._16_4_ | (uint)!bVar79 * auVar109._16_4_;
      bVar79 = (bool)(bVar76 >> 5 & 1);
      auVar121._20_4_ = (uint)bVar79 * auVar120._20_4_ | (uint)!bVar79 * auVar109._20_4_;
      bVar79 = (bool)(bVar76 >> 6 & 1);
      auVar121._24_4_ = (uint)bVar79 * auVar120._24_4_ | (uint)!bVar79 * auVar109._24_4_;
      auVar121._28_4_ =
           (uint)(bVar76 >> 7) * auVar120._28_4_ | (uint)!(bool)(bVar76 >> 7) * auVar109._28_4_;
      auVar105 = vmaxps_avx512vl(auVar105,auVar121);
      auVar246 = ZEXT3264(auVar105);
      uVar16 = vcmpps_avx512vl(auVar106,auVar111,6);
      bVar76 = (byte)uVar14 | (byte)uVar16;
      auVar122._0_4_ = (uint)(bVar76 & 1) * 0x7f800000 | (uint)!(bool)(bVar76 & 1) * (int)fVar210;
      bVar79 = (bool)(bVar76 >> 1 & 1);
      auVar122._4_4_ = (uint)bVar79 * 0x7f800000 | (uint)!bVar79 * (int)fVar139;
      bVar79 = (bool)(bVar76 >> 2 & 1);
      auVar122._8_4_ = (uint)bVar79 * 0x7f800000 | (uint)!bVar79 * (int)fVar204;
      bVar79 = (bool)(bVar76 >> 3 & 1);
      auVar122._12_4_ = (uint)bVar79 * 0x7f800000 | (uint)!bVar79 * (int)fVar205;
      bVar79 = (bool)(bVar76 >> 4 & 1);
      auVar122._16_4_ = (uint)bVar79 * 0x7f800000 | (uint)!bVar79 * (int)fVar206;
      bVar79 = (bool)(bVar76 >> 5 & 1);
      auVar122._20_4_ = (uint)bVar79 * 0x7f800000 | (uint)!bVar79 * (int)fVar207;
      bVar79 = (bool)(bVar76 >> 6 & 1);
      auVar122._24_4_ = (uint)bVar79 * 0x7f800000 | (uint)!bVar79 * (int)fVar208;
      auVar122._28_4_ =
           (uint)(bVar76 >> 7) * 0x7f800000 | (uint)!(bool)(bVar76 >> 7) * auVar95._28_4_;
      auVar95 = vminps_avx512vl(auVar108,auVar122);
      auVar84 = vxorps_avx512vl(auVar108._0_16_,auVar108._0_16_);
      auVar106 = vsubps_avx512vl(ZEXT1632(auVar84),local_900);
      auVar102 = vsubps_avx512vl(ZEXT1632(auVar84),auVar102);
      auVar108 = ZEXT1632(auVar84);
      auVar103 = vsubps_avx512vl(auVar108,auVar103);
      auVar103 = vmulps_avx512vl(auVar103,auVar104);
      auVar102 = vfmadd231ps_avx512vl(auVar103,auVar91,auVar102);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar90,auVar106);
      auVar103 = vmulps_avx512vl(auVar69,auVar104);
      auVar103 = vfmadd231ps_avx512vl(auVar103,local_440,auVar91);
      auVar103 = vfmadd231ps_avx512vl(auVar103,local_420,auVar90);
      auVar32._8_4_ = 0x7fffffff;
      auVar32._0_8_ = 0x7fffffff7fffffff;
      auVar32._12_4_ = 0x7fffffff;
      auVar32._16_4_ = 0x7fffffff;
      auVar32._20_4_ = 0x7fffffff;
      auVar32._24_4_ = 0x7fffffff;
      auVar32._28_4_ = 0x7fffffff;
      vandps_avx512vl(auVar103,auVar32);
      uVar14 = vcmpps_avx512vl(auVar103,auVar107,1);
      auVar102 = vxorps_avx512vl(auVar102,auVar92);
      auVar90 = vrcp14ps_avx512vl(auVar103);
      auVar92 = vxorps_avx512vl(auVar103,auVar92);
      auVar242 = ZEXT3264(auVar92);
      auVar91 = vfnmadd213ps_avx512vl(auVar90,auVar103,auVar118);
      auVar84 = vfmadd132ps_fma(auVar91,auVar90,auVar90);
      fVar210 = auVar84._0_4_ * auVar102._0_4_;
      fVar139 = auVar84._4_4_ * auVar102._4_4_;
      auVar55._4_4_ = fVar139;
      auVar55._0_4_ = fVar210;
      fVar204 = auVar84._8_4_ * auVar102._8_4_;
      auVar55._8_4_ = fVar204;
      fVar205 = auVar84._12_4_ * auVar102._12_4_;
      auVar55._12_4_ = fVar205;
      fVar206 = auVar102._16_4_ * 0.0;
      auVar55._16_4_ = fVar206;
      fVar207 = auVar102._20_4_ * 0.0;
      auVar55._20_4_ = fVar207;
      fVar208 = auVar102._24_4_ * 0.0;
      auVar55._24_4_ = fVar208;
      auVar55._28_4_ = auVar102._28_4_;
      uVar16 = vcmpps_avx512vl(auVar103,auVar92,1);
      bVar76 = (byte)uVar14 | (byte)uVar16;
      auVar91 = vblendmps_avx512vl(auVar55,auVar119);
      auVar123._0_4_ =
           (uint)(bVar76 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar90._0_4_;
      bVar79 = (bool)(bVar76 >> 1 & 1);
      auVar123._4_4_ = (uint)bVar79 * auVar91._4_4_ | (uint)!bVar79 * auVar90._4_4_;
      bVar79 = (bool)(bVar76 >> 2 & 1);
      auVar123._8_4_ = (uint)bVar79 * auVar91._8_4_ | (uint)!bVar79 * auVar90._8_4_;
      bVar79 = (bool)(bVar76 >> 3 & 1);
      auVar123._12_4_ = (uint)bVar79 * auVar91._12_4_ | (uint)!bVar79 * auVar90._12_4_;
      bVar79 = (bool)(bVar76 >> 4 & 1);
      auVar123._16_4_ = (uint)bVar79 * auVar91._16_4_ | (uint)!bVar79 * auVar90._16_4_;
      bVar79 = (bool)(bVar76 >> 5 & 1);
      auVar123._20_4_ = (uint)bVar79 * auVar91._20_4_ | (uint)!bVar79 * auVar90._20_4_;
      bVar79 = (bool)(bVar76 >> 6 & 1);
      auVar123._24_4_ = (uint)bVar79 * auVar91._24_4_ | (uint)!bVar79 * auVar90._24_4_;
      auVar123._28_4_ =
           (uint)(bVar76 >> 7) * auVar91._28_4_ | (uint)!(bool)(bVar76 >> 7) * auVar90._28_4_;
      _local_380 = vmaxps_avx512vl(auVar105,auVar123);
      uVar16 = vcmpps_avx512vl(auVar103,auVar92,6);
      bVar76 = (byte)uVar14 | (byte)uVar16;
      auVar124._0_4_ = (uint)(bVar76 & 1) * 0x7f800000 | (uint)!(bool)(bVar76 & 1) * (int)fVar210;
      bVar79 = (bool)(bVar76 >> 1 & 1);
      auVar124._4_4_ = (uint)bVar79 * 0x7f800000 | (uint)!bVar79 * (int)fVar139;
      bVar79 = (bool)(bVar76 >> 2 & 1);
      auVar124._8_4_ = (uint)bVar79 * 0x7f800000 | (uint)!bVar79 * (int)fVar204;
      bVar79 = (bool)(bVar76 >> 3 & 1);
      auVar124._12_4_ = (uint)bVar79 * 0x7f800000 | (uint)!bVar79 * (int)fVar205;
      bVar79 = (bool)(bVar76 >> 4 & 1);
      auVar124._16_4_ = (uint)bVar79 * 0x7f800000 | (uint)!bVar79 * (int)fVar206;
      bVar79 = (bool)(bVar76 >> 5 & 1);
      auVar124._20_4_ = (uint)bVar79 * 0x7f800000 | (uint)!bVar79 * (int)fVar207;
      bVar79 = (bool)(bVar76 >> 6 & 1);
      auVar124._24_4_ = (uint)bVar79 * 0x7f800000 | (uint)!bVar79 * (int)fVar208;
      auVar124._28_4_ =
           (uint)(bVar76 >> 7) * 0x7f800000 | (uint)!(bool)(bVar76 >> 7) * auVar102._28_4_;
      local_320 = vminps_avx(auVar95,auVar124);
      auVar235 = ZEXT3264(local_320);
      uVar14 = vcmpps_avx512vl(_local_380,local_320,2);
      bVar72 = bVar72 & 0x7f & (byte)uVar14;
      if (bVar72 == 0) {
        auVar260 = ZEXT3264(auVar118);
        goto LAB_01a382cb;
      }
      auVar102 = vmaxps_avx512vl(auVar108,local_5a0);
      auVar95 = vfmadd213ps_avx512vl(auVar115,auVar112,auVar96);
      auVar95 = vmulps_avx512vl(auVar93,auVar95);
      auVar103 = vfmadd213ps_avx512vl(local_500,auVar112,auVar96);
      fVar210 = auVar93._0_4_;
      fVar139 = auVar93._4_4_;
      auVar56._4_4_ = fVar139 * auVar103._4_4_;
      auVar56._0_4_ = fVar210 * auVar103._0_4_;
      fVar204 = auVar93._8_4_;
      auVar56._8_4_ = fVar204 * auVar103._8_4_;
      fVar205 = auVar93._12_4_;
      auVar56._12_4_ = fVar205 * auVar103._12_4_;
      fVar206 = auVar93._16_4_;
      auVar56._16_4_ = fVar206 * auVar103._16_4_;
      fVar207 = auVar93._20_4_;
      auVar56._20_4_ = fVar207 * auVar103._20_4_;
      fVar208 = auVar93._24_4_;
      auVar56._24_4_ = fVar208 * auVar103._24_4_;
      auVar56._28_4_ = auVar103._28_4_;
      auVar95 = vminps_avx512vl(auVar95,auVar118);
      auVar103 = SUB6432(ZEXT864(0),0) << 0x20;
      auVar95 = vmaxps_avx(auVar95,ZEXT832(0) << 0x20);
      auVar92 = vminps_avx512vl(auVar56,auVar118);
      auVar57._4_4_ = (auVar95._4_4_ + 1.0) * 0.125;
      auVar57._0_4_ = (auVar95._0_4_ + 0.0) * 0.125;
      auVar57._8_4_ = (auVar95._8_4_ + 2.0) * 0.125;
      auVar57._12_4_ = (auVar95._12_4_ + 3.0) * 0.125;
      auVar57._16_4_ = (auVar95._16_4_ + 4.0) * 0.125;
      auVar57._20_4_ = (auVar95._20_4_ + 5.0) * 0.125;
      auVar57._24_4_ = (auVar95._24_4_ + 6.0) * 0.125;
      auVar57._28_4_ = auVar95._28_4_ + 7.0;
      local_1a0 = vfmadd213ps_avx512vl(auVar57,local_720,local_700);
      auVar95 = vmaxps_avx(auVar92,ZEXT832(0) << 0x20);
      auVar58._4_4_ = (auVar95._4_4_ + 1.0) * 0.125;
      auVar58._0_4_ = (auVar95._0_4_ + 0.0) * 0.125;
      auVar58._8_4_ = (auVar95._8_4_ + 2.0) * 0.125;
      auVar58._12_4_ = (auVar95._12_4_ + 3.0) * 0.125;
      auVar58._16_4_ = (auVar95._16_4_ + 4.0) * 0.125;
      auVar58._20_4_ = (auVar95._20_4_ + 5.0) * 0.125;
      auVar58._24_4_ = (auVar95._24_4_ + 6.0) * 0.125;
      auVar58._28_4_ = auVar95._28_4_ + 7.0;
      local_1c0 = vfmadd213ps_avx512vl(auVar58,local_720,local_700);
      auVar59._4_4_ = auVar102._4_4_ * auVar102._4_4_;
      auVar59._0_4_ = auVar102._0_4_ * auVar102._0_4_;
      auVar59._8_4_ = auVar102._8_4_ * auVar102._8_4_;
      auVar59._12_4_ = auVar102._12_4_ * auVar102._12_4_;
      auVar59._16_4_ = auVar102._16_4_ * auVar102._16_4_;
      auVar59._20_4_ = auVar102._20_4_ * auVar102._20_4_;
      auVar59._24_4_ = auVar102._24_4_ * auVar102._24_4_;
      auVar59._28_4_ = auVar102._28_4_;
      auVar95 = vsubps_avx(local_5c0,auVar59);
      auVar60._4_4_ = auVar95._4_4_ * (float)local_4c0._4_4_;
      auVar60._0_4_ = auVar95._0_4_ * (float)local_4c0._0_4_;
      auVar60._8_4_ = auVar95._8_4_ * fStack_4b8;
      auVar60._12_4_ = auVar95._12_4_ * fStack_4b4;
      auVar60._16_4_ = auVar95._16_4_ * fStack_4b0;
      auVar60._20_4_ = auVar95._20_4_ * fStack_4ac;
      auVar60._24_4_ = auVar95._24_4_ * fStack_4a8;
      auVar60._28_4_ = auVar102._28_4_;
      auVar102 = vsubps_avx(local_6c0,auVar60);
      uVar14 = vcmpps_avx512vl(auVar102,ZEXT832(0) << 0x20,5);
      bVar76 = (byte)uVar14;
      auVar258 = ZEXT3264(local_740);
      auVar259 = ZEXT3264(local_760);
      if (bVar76 == 0) {
        bVar76 = 0;
        auVar93 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar242 = ZEXT864(0) << 0x20;
        auVar102 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar92 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar240 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar125._8_4_ = 0x7f800000;
        auVar125._0_8_ = 0x7f8000007f800000;
        auVar125._12_4_ = 0x7f800000;
        auVar125._16_4_ = 0x7f800000;
        auVar125._20_4_ = 0x7f800000;
        auVar125._24_4_ = 0x7f800000;
        auVar125._28_4_ = 0x7f800000;
        auVar126._8_4_ = 0xff800000;
        auVar126._0_8_ = 0xff800000ff800000;
        auVar126._12_4_ = 0xff800000;
        auVar126._16_4_ = 0xff800000;
        auVar126._20_4_ = 0xff800000;
        auVar126._24_4_ = 0xff800000;
        auVar126._28_4_ = 0xff800000;
        auVar249._8_4_ = 0x3e99999a;
        auVar249._0_8_ = 0x3e99999a3e99999a;
        auVar249._12_4_ = 0x3e99999a;
        auVar249._16_4_ = 0x3e99999a;
        auVar249._20_4_ = 0x3e99999a;
        auVar249._24_4_ = 0x3e99999a;
        auVar249._28_4_ = 0x3e99999a;
      }
      else {
        auVar85 = vxorps_avx512vl(auVar141,auVar141);
        uVar80 = vcmpps_avx512vl(auVar102,auVar108,5);
        auVar102 = vsqrtps_avx(auVar102);
        auVar103 = vfnmadd213ps_avx512vl(auVar114,local_6e0,auVar118);
        auVar90 = vfmadd132ps_avx512vl(auVar103,local_6e0,local_6e0);
        auVar103 = vsubps_avx(local_4e0,auVar102);
        auVar91 = vmulps_avx512vl(auVar103,auVar90);
        auVar102 = vsubps_avx512vl(auVar102,auVar110);
        auVar90 = vmulps_avx512vl(auVar102,auVar90);
        auVar102 = vfmadd213ps_avx512vl(auVar112,auVar91,auVar96);
        auVar61._4_4_ = fVar139 * auVar102._4_4_;
        auVar61._0_4_ = fVar210 * auVar102._0_4_;
        auVar61._8_4_ = fVar204 * auVar102._8_4_;
        auVar61._12_4_ = fVar205 * auVar102._12_4_;
        auVar61._16_4_ = fVar206 * auVar102._16_4_;
        auVar61._20_4_ = fVar207 * auVar102._20_4_;
        auVar61._24_4_ = fVar208 * auVar102._24_4_;
        auVar61._28_4_ = auVar92._28_4_;
        auVar102 = vmulps_avx512vl(local_420,auVar91);
        auVar103 = vmulps_avx512vl(local_440,auVar91);
        auVar70._4_4_ = uStack_49c;
        auVar70._0_4_ = local_4a0;
        auVar70._8_4_ = uStack_498;
        auVar70._12_4_ = uStack_494;
        auVar70._16_4_ = uStack_490;
        auVar70._20_4_ = uStack_48c;
        auVar70._24_4_ = uStack_488;
        auVar70._28_4_ = uStack_484;
        auVar104 = vmulps_avx512vl(auVar70,auVar91);
        auVar92 = vfmadd213ps_avx512vl(auVar97,auVar61,auVar101);
        auVar102 = vsubps_avx512vl(auVar102,auVar92);
        auVar92 = vfmadd213ps_avx512vl(auVar98,auVar61,auVar99);
        auVar92 = vsubps_avx512vl(auVar103,auVar92);
        auVar84 = vfmadd213ps_fma(auVar61,auVar94,auVar100);
        auVar103 = vsubps_avx(auVar104,ZEXT1632(auVar84));
        auVar240 = auVar103._0_28_;
        auVar96 = vfmadd213ps_avx512vl(auVar112,auVar90,auVar96);
        auVar62._4_4_ = fVar139 * auVar96._4_4_;
        auVar62._0_4_ = fVar210 * auVar96._0_4_;
        auVar62._8_4_ = fVar204 * auVar96._8_4_;
        auVar62._12_4_ = fVar205 * auVar96._12_4_;
        auVar62._16_4_ = fVar206 * auVar96._16_4_;
        auVar62._20_4_ = fVar207 * auVar96._20_4_;
        auVar62._24_4_ = fVar208 * auVar96._24_4_;
        auVar62._28_4_ = auVar93._28_4_;
        auVar93 = vmulps_avx512vl(local_420,auVar90);
        auVar96 = vmulps_avx512vl(local_440,auVar90);
        auVar104 = vmulps_avx512vl(auVar70,auVar90);
        auVar84 = vfmadd213ps_fma(auVar97,auVar62,auVar101);
        auVar103 = vsubps_avx(auVar93,ZEXT1632(auVar84));
        auVar84 = vfmadd213ps_fma(auVar98,auVar62,auVar99);
        auVar93 = vsubps_avx(auVar96,ZEXT1632(auVar84));
        auVar84 = vfmadd213ps_fma(auVar94,auVar62,auVar100);
        auVar96 = vsubps_avx512vl(auVar104,ZEXT1632(auVar84));
        auVar242 = ZEXT3264(auVar96);
        auVar149._8_4_ = 0x7f800000;
        auVar149._0_8_ = 0x7f8000007f800000;
        auVar149._12_4_ = 0x7f800000;
        auVar149._16_4_ = 0x7f800000;
        auVar149._20_4_ = 0x7f800000;
        auVar149._24_4_ = 0x7f800000;
        auVar149._28_4_ = 0x7f800000;
        auVar96 = vblendmps_avx512vl(auVar149,auVar91);
        bVar79 = (bool)((byte)uVar80 & 1);
        auVar125._0_4_ = (uint)bVar79 * auVar96._0_4_ | (uint)!bVar79 * auVar101._0_4_;
        bVar79 = (bool)((byte)(uVar80 >> 1) & 1);
        auVar125._4_4_ = (uint)bVar79 * auVar96._4_4_ | (uint)!bVar79 * auVar101._4_4_;
        bVar79 = (bool)((byte)(uVar80 >> 2) & 1);
        auVar125._8_4_ = (uint)bVar79 * auVar96._8_4_ | (uint)!bVar79 * auVar101._8_4_;
        bVar79 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar125._12_4_ = (uint)bVar79 * auVar96._12_4_ | (uint)!bVar79 * auVar101._12_4_;
        bVar79 = (bool)((byte)(uVar80 >> 4) & 1);
        auVar125._16_4_ = (uint)bVar79 * auVar96._16_4_ | (uint)!bVar79 * auVar101._16_4_;
        bVar79 = (bool)((byte)(uVar80 >> 5) & 1);
        auVar125._20_4_ = (uint)bVar79 * auVar96._20_4_ | (uint)!bVar79 * auVar101._20_4_;
        bVar79 = (bool)((byte)(uVar80 >> 6) & 1);
        auVar125._24_4_ = (uint)bVar79 * auVar96._24_4_ | (uint)!bVar79 * auVar101._24_4_;
        bVar79 = SUB81(uVar80 >> 7,0);
        auVar125._28_4_ = (uint)bVar79 * auVar96._28_4_ | (uint)!bVar79 * auVar101._28_4_;
        auVar150._8_4_ = 0xff800000;
        auVar150._0_8_ = 0xff800000ff800000;
        auVar150._12_4_ = 0xff800000;
        auVar150._16_4_ = 0xff800000;
        auVar150._20_4_ = 0xff800000;
        auVar150._24_4_ = 0xff800000;
        auVar150._28_4_ = 0xff800000;
        auVar96 = vblendmps_avx512vl(auVar150,auVar90);
        bVar79 = (bool)((byte)uVar80 & 1);
        auVar126._0_4_ = (uint)bVar79 * auVar96._0_4_ | (uint)!bVar79 * -0x800000;
        bVar79 = (bool)((byte)(uVar80 >> 1) & 1);
        auVar126._4_4_ = (uint)bVar79 * auVar96._4_4_ | (uint)!bVar79 * -0x800000;
        bVar79 = (bool)((byte)(uVar80 >> 2) & 1);
        auVar126._8_4_ = (uint)bVar79 * auVar96._8_4_ | (uint)!bVar79 * -0x800000;
        bVar79 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar126._12_4_ = (uint)bVar79 * auVar96._12_4_ | (uint)!bVar79 * -0x800000;
        bVar79 = (bool)((byte)(uVar80 >> 4) & 1);
        auVar126._16_4_ = (uint)bVar79 * auVar96._16_4_ | (uint)!bVar79 * -0x800000;
        bVar79 = (bool)((byte)(uVar80 >> 5) & 1);
        auVar126._20_4_ = (uint)bVar79 * auVar96._20_4_ | (uint)!bVar79 * -0x800000;
        bVar79 = (bool)((byte)(uVar80 >> 6) & 1);
        auVar126._24_4_ = (uint)bVar79 * auVar96._24_4_ | (uint)!bVar79 * -0x800000;
        bVar79 = SUB81(uVar80 >> 7,0);
        auVar126._28_4_ = (uint)bVar79 * auVar96._28_4_ | (uint)!bVar79 * -0x800000;
        auVar33._8_4_ = 0x36000000;
        auVar33._0_8_ = 0x3600000036000000;
        auVar33._12_4_ = 0x36000000;
        auVar33._16_4_ = 0x36000000;
        auVar33._20_4_ = 0x36000000;
        auVar33._24_4_ = 0x36000000;
        auVar33._28_4_ = 0x36000000;
        auVar96 = vmulps_avx512vl(local_520,auVar33);
        uVar77 = vcmpps_avx512vl(auVar96,local_660,0xe);
        uVar80 = uVar80 & uVar77;
        bVar74 = (byte)uVar80;
        auVar249._8_4_ = 0x3e99999a;
        auVar249._0_8_ = 0x3e99999a3e99999a;
        auVar249._12_4_ = 0x3e99999a;
        auVar249._16_4_ = 0x3e99999a;
        auVar249._20_4_ = 0x3e99999a;
        auVar249._24_4_ = 0x3e99999a;
        auVar249._28_4_ = 0x3e99999a;
        if (bVar74 != 0) {
          uVar77 = vcmpps_avx512vl(auVar95,ZEXT1632(auVar85),2);
          auVar228._8_4_ = 0x7f800000;
          auVar228._0_8_ = 0x7f8000007f800000;
          auVar228._12_4_ = 0x7f800000;
          auVar228._16_4_ = 0x7f800000;
          auVar228._20_4_ = 0x7f800000;
          auVar228._24_4_ = 0x7f800000;
          auVar228._28_4_ = 0x7f800000;
          auVar245._8_4_ = 0xff800000;
          auVar245._0_8_ = 0xff800000ff800000;
          auVar245._12_4_ = 0xff800000;
          auVar245._16_4_ = 0xff800000;
          auVar245._20_4_ = 0xff800000;
          auVar245._24_4_ = 0xff800000;
          auVar245._28_4_ = 0xff800000;
          auVar95 = vblendmps_avx512vl(auVar228,auVar245);
          bVar73 = (byte)uVar77;
          uVar81 = (uint)(bVar73 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar96._0_4_;
          bVar79 = (bool)((byte)(uVar77 >> 1) & 1);
          uVar132 = (uint)bVar79 * auVar95._4_4_ | (uint)!bVar79 * auVar96._4_4_;
          bVar79 = (bool)((byte)(uVar77 >> 2) & 1);
          uVar133 = (uint)bVar79 * auVar95._8_4_ | (uint)!bVar79 * auVar96._8_4_;
          bVar79 = (bool)((byte)(uVar77 >> 3) & 1);
          uVar134 = (uint)bVar79 * auVar95._12_4_ | (uint)!bVar79 * auVar96._12_4_;
          bVar79 = (bool)((byte)(uVar77 >> 4) & 1);
          uVar135 = (uint)bVar79 * auVar95._16_4_ | (uint)!bVar79 * auVar96._16_4_;
          bVar79 = (bool)((byte)(uVar77 >> 5) & 1);
          uVar136 = (uint)bVar79 * auVar95._20_4_ | (uint)!bVar79 * auVar96._20_4_;
          bVar79 = (bool)((byte)(uVar77 >> 6) & 1);
          uVar137 = (uint)bVar79 * auVar95._24_4_ | (uint)!bVar79 * auVar96._24_4_;
          bVar79 = SUB81(uVar77 >> 7,0);
          uVar138 = (uint)bVar79 * auVar95._28_4_ | (uint)!bVar79 * auVar96._28_4_;
          auVar125._0_4_ = (bVar74 & 1) * uVar81 | !(bool)(bVar74 & 1) * auVar125._0_4_;
          bVar79 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar125._4_4_ = bVar79 * uVar132 | !bVar79 * auVar125._4_4_;
          bVar79 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar125._8_4_ = bVar79 * uVar133 | !bVar79 * auVar125._8_4_;
          bVar79 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar125._12_4_ = bVar79 * uVar134 | !bVar79 * auVar125._12_4_;
          bVar79 = (bool)((byte)(uVar80 >> 4) & 1);
          auVar125._16_4_ = bVar79 * uVar135 | !bVar79 * auVar125._16_4_;
          bVar79 = (bool)((byte)(uVar80 >> 5) & 1);
          auVar125._20_4_ = bVar79 * uVar136 | !bVar79 * auVar125._20_4_;
          bVar79 = (bool)((byte)(uVar80 >> 6) & 1);
          auVar125._24_4_ = bVar79 * uVar137 | !bVar79 * auVar125._24_4_;
          bVar79 = SUB81(uVar80 >> 7,0);
          auVar125._28_4_ = bVar79 * uVar138 | !bVar79 * auVar125._28_4_;
          auVar95 = vblendmps_avx512vl(auVar245,auVar228);
          bVar79 = (bool)((byte)(uVar77 >> 1) & 1);
          bVar8 = (bool)((byte)(uVar77 >> 2) & 1);
          bVar9 = (bool)((byte)(uVar77 >> 3) & 1);
          bVar10 = (bool)((byte)(uVar77 >> 4) & 1);
          bVar11 = (bool)((byte)(uVar77 >> 5) & 1);
          bVar12 = (bool)((byte)(uVar77 >> 6) & 1);
          bVar13 = SUB81(uVar77 >> 7,0);
          auVar126._0_4_ =
               (uint)(bVar74 & 1) *
               ((uint)(bVar73 & 1) * auVar95._0_4_ | !(bool)(bVar73 & 1) * uVar81) |
               !(bool)(bVar74 & 1) * auVar126._0_4_;
          bVar7 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar126._4_4_ =
               (uint)bVar7 * ((uint)bVar79 * auVar95._4_4_ | !bVar79 * uVar132) |
               !bVar7 * auVar126._4_4_;
          bVar79 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar126._8_4_ =
               (uint)bVar79 * ((uint)bVar8 * auVar95._8_4_ | !bVar8 * uVar133) |
               !bVar79 * auVar126._8_4_;
          bVar79 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar126._12_4_ =
               (uint)bVar79 * ((uint)bVar9 * auVar95._12_4_ | !bVar9 * uVar134) |
               !bVar79 * auVar126._12_4_;
          bVar79 = (bool)((byte)(uVar80 >> 4) & 1);
          auVar126._16_4_ =
               (uint)bVar79 * ((uint)bVar10 * auVar95._16_4_ | !bVar10 * uVar135) |
               !bVar79 * auVar126._16_4_;
          bVar79 = (bool)((byte)(uVar80 >> 5) & 1);
          auVar126._20_4_ =
               (uint)bVar79 * ((uint)bVar11 * auVar95._20_4_ | !bVar11 * uVar136) |
               !bVar79 * auVar126._20_4_;
          bVar79 = (bool)((byte)(uVar80 >> 6) & 1);
          auVar126._24_4_ =
               (uint)bVar79 * ((uint)bVar12 * auVar95._24_4_ | !bVar12 * uVar137) |
               !bVar79 * auVar126._24_4_;
          bVar79 = SUB81(uVar80 >> 7,0);
          auVar126._28_4_ =
               (uint)bVar79 * ((uint)bVar13 * auVar95._28_4_ | !bVar13 * uVar138) |
               !bVar79 * auVar126._28_4_;
          bVar76 = (~bVar74 | bVar73) & bVar76;
        }
      }
      auVar250 = ZEXT3264(local_800);
      auVar251 = ZEXT3264(local_820);
      auVar252 = ZEXT3264(local_840);
      auVar253 = ZEXT3264(local_860);
      auVar254 = ZEXT3264(local_880);
      auVar255 = ZEXT3264(local_8a0);
      auVar256 = ZEXT3264(local_8c0);
      auVar257 = ZEXT3264(local_8e0);
      uVar140 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
      auVar222._4_4_ = uVar140;
      auVar222._0_4_ = uVar140;
      auVar222._8_4_ = uVar140;
      auVar222._12_4_ = uVar140;
      auVar222._16_4_ = uVar140;
      auVar222._20_4_ = uVar140;
      auVar222._24_4_ = uVar140;
      auVar222._28_4_ = uVar140;
      uVar140 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
      auVar229._4_4_ = uVar140;
      auVar229._0_4_ = uVar140;
      auVar229._8_4_ = uVar140;
      auVar229._12_4_ = uVar140;
      auVar229._16_4_ = uVar140;
      auVar229._20_4_ = uVar140;
      auVar229._24_4_ = uVar140;
      auVar229._28_4_ = uVar140;
      auVar230 = ZEXT3264(auVar229);
      fVar210 = (ray->super_RayK<1>).dir.field_0.m128[2];
      auVar246 = ZEXT3264(CONCAT428(fVar210,CONCAT424(fVar210,CONCAT420(fVar210,CONCAT416(fVar210,
                                                  CONCAT412(fVar210,CONCAT48(fVar210,CONCAT44(
                                                  fVar210,fVar210))))))));
      auVar221._0_4_ = fVar210 * auVar242._0_4_;
      auVar221._4_4_ = fVar210 * auVar242._4_4_;
      auVar221._8_4_ = fVar210 * auVar242._8_4_;
      auVar221._12_4_ = fVar210 * auVar242._12_4_;
      auVar221._16_4_ = fVar210 * auVar242._16_4_;
      auVar221._20_4_ = fVar210 * auVar242._20_4_;
      auVar221._28_36_ = auVar242._28_36_;
      auVar221._24_4_ = fVar210 * auVar242._24_4_;
      auVar84 = vfmadd231ps_fma(auVar221._0_32_,auVar229,auVar93);
      auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar222,auVar103);
      local_360 = vminps_avx(local_320,auVar125);
      auVar241._8_4_ = 0x7fffffff;
      auVar241._0_8_ = 0x7fffffff7fffffff;
      auVar241._12_4_ = 0x7fffffff;
      auVar241._16_4_ = 0x7fffffff;
      auVar241._20_4_ = 0x7fffffff;
      auVar241._24_4_ = 0x7fffffff;
      auVar241._28_4_ = 0x7fffffff;
      auVar242 = ZEXT3264(auVar241);
      auVar95 = vandps_avx(auVar241,ZEXT1632(auVar84));
      _local_340 = vmaxps_avx512vl(_local_380,auVar126);
      uVar14 = vcmpps_avx512vl(auVar95,auVar249,1);
      uVar16 = vcmpps_avx512vl(_local_380,local_360,2);
      bVar74 = (byte)uVar16 & bVar72;
      uVar15 = vcmpps_avx512vl(_local_340,local_320,2);
      if ((bVar72 & ((byte)uVar15 | (byte)uVar16)) == 0) {
        auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar260 = ZEXT3264(auVar95);
      }
      else {
        _local_460 = _local_340;
        local_768 = (uint)(byte)((byte)uVar14 | ~bVar76);
        auVar63._4_4_ = auVar240._4_4_ * fVar210;
        auVar63._0_4_ = auVar240._0_4_ * fVar210;
        auVar63._8_4_ = auVar240._8_4_ * fVar210;
        auVar63._12_4_ = auVar240._12_4_ * fVar210;
        auVar63._16_4_ = auVar240._16_4_ * fVar210;
        auVar63._20_4_ = auVar240._20_4_ * fVar210;
        auVar63._24_4_ = auVar240._24_4_ * fVar210;
        auVar63._28_4_ = local_340._28_4_;
        auVar84 = vfmadd213ps_fma(auVar92,auVar229,auVar63);
        auVar84 = vfmadd213ps_fma(auVar102,auVar222,ZEXT1632(auVar84));
        auVar95 = vandps_avx(auVar241,ZEXT1632(auVar84));
        uVar14 = vcmpps_avx512vl(auVar95,auVar249,1);
        bVar76 = (byte)uVar14 | ~bVar76;
        auVar153._8_4_ = 2;
        auVar153._0_8_ = 0x200000002;
        auVar153._12_4_ = 2;
        auVar153._16_4_ = 2;
        auVar153._20_4_ = 2;
        auVar153._24_4_ = 2;
        auVar153._28_4_ = 2;
        auVar34._8_4_ = 3;
        auVar34._0_8_ = 0x300000003;
        auVar34._12_4_ = 3;
        auVar34._16_4_ = 3;
        auVar34._20_4_ = 3;
        auVar34._24_4_ = 3;
        auVar34._28_4_ = 3;
        auVar95 = vpblendmd_avx512vl(auVar153,auVar34);
        local_300._0_4_ = (uint)(bVar76 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar76 & 1) * 2;
        bVar79 = (bool)(bVar76 >> 1 & 1);
        local_300._4_4_ = (uint)bVar79 * auVar95._4_4_ | (uint)!bVar79 * 2;
        bVar79 = (bool)(bVar76 >> 2 & 1);
        local_300._8_4_ = (uint)bVar79 * auVar95._8_4_ | (uint)!bVar79 * 2;
        bVar79 = (bool)(bVar76 >> 3 & 1);
        local_300._12_4_ = (uint)bVar79 * auVar95._12_4_ | (uint)!bVar79 * 2;
        bVar79 = (bool)(bVar76 >> 4 & 1);
        local_300._16_4_ = (uint)bVar79 * auVar95._16_4_ | (uint)!bVar79 * 2;
        bVar79 = (bool)(bVar76 >> 5 & 1);
        local_300._20_4_ = (uint)bVar79 * auVar95._20_4_ | (uint)!bVar79 * 2;
        bVar79 = (bool)(bVar76 >> 6 & 1);
        local_300._24_4_ = (uint)bVar79 * auVar95._24_4_ | (uint)!bVar79 * 2;
        local_300._28_4_ = (uint)(bVar76 >> 7) * auVar95._28_4_ | (uint)!(bool)(bVar76 >> 7) * 2;
        local_3a0 = vpbroadcastd_avx512vl();
        uVar14 = vpcmpd_avx512vl(local_3a0,local_300,5);
        local_764 = (uint)bVar74;
        bVar74 = (byte)uVar14 & bVar74;
        local_3e0 = _local_380;
        _local_400 = vaddps_avx512vl(_local_380,_local_480);
        _local_4c0 = auVar113;
        for (; auVar95 = local_900, auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000)),
            bVar74 != 0; bVar74 = ~('\x01' << ((byte)iVar17 & 0x1f)) & bVar74 & (byte)uVar14) {
          auVar154._8_4_ = 0x7f800000;
          auVar154._0_8_ = 0x7f8000007f800000;
          auVar154._12_4_ = 0x7f800000;
          auVar154._16_4_ = 0x7f800000;
          auVar154._20_4_ = 0x7f800000;
          auVar154._24_4_ = 0x7f800000;
          auVar154._28_4_ = 0x7f800000;
          auVar93 = vblendmps_avx512vl(auVar154,local_3e0);
          auVar128._0_4_ =
               (uint)(bVar74 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar74 & 1) * 0x7f800000;
          bVar79 = (bool)(bVar74 >> 1 & 1);
          auVar128._4_4_ = (uint)bVar79 * auVar93._4_4_ | (uint)!bVar79 * 0x7f800000;
          bVar79 = (bool)(bVar74 >> 2 & 1);
          auVar128._8_4_ = (uint)bVar79 * auVar93._8_4_ | (uint)!bVar79 * 0x7f800000;
          bVar79 = (bool)(bVar74 >> 3 & 1);
          auVar128._12_4_ = (uint)bVar79 * auVar93._12_4_ | (uint)!bVar79 * 0x7f800000;
          bVar79 = (bool)(bVar74 >> 4 & 1);
          auVar128._16_4_ = (uint)bVar79 * auVar93._16_4_ | (uint)!bVar79 * 0x7f800000;
          bVar79 = (bool)(bVar74 >> 5 & 1);
          auVar128._20_4_ = (uint)bVar79 * auVar93._20_4_ | (uint)!bVar79 * 0x7f800000;
          bVar79 = (bool)(bVar74 >> 6 & 1);
          auVar128._24_4_ = (uint)bVar79 * auVar93._24_4_ | (uint)!bVar79 * 0x7f800000;
          auVar128._28_4_ =
               (uint)(bVar74 >> 7) * auVar93._28_4_ | (uint)!(bool)(bVar74 >> 7) * 0x7f800000;
          auVar93 = vshufps_avx(auVar128,auVar128,0xb1);
          auVar93 = vminps_avx(auVar128,auVar93);
          auVar96 = vshufpd_avx(auVar93,auVar93,5);
          auVar93 = vminps_avx(auVar93,auVar96);
          auVar96 = vpermpd_avx2(auVar93,0x4e);
          auVar93 = vminps_avx(auVar93,auVar96);
          uVar14 = vcmpps_avx512vl(auVar128,auVar93,0);
          bVar73 = (byte)uVar14 & bVar74;
          bVar76 = bVar74;
          if (bVar73 != 0) {
            bVar76 = bVar73;
          }
          iVar17 = 0;
          for (uVar81 = (uint)bVar76; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x80000000) {
            iVar17 = iVar17 + 1;
          }
          auVar230 = ZEXT464(*(uint *)(local_380 + (uint)(iVar17 << 2)));
          aVar1 = (ray->super_RayK<1>).dir.field_0;
          local_5a0._0_16_ = (undefined1  [16])aVar1;
          auVar84 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
          if (auVar84._0_4_ < 0.0) {
            local_900[1] = 0;
            local_900[0] = bVar74;
            local_900._2_30_ = auVar95._2_30_;
            local_700._0_16_ = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar17 << 2)));
            local_720._0_16_ = ZEXT416(*(uint *)(local_380 + (uint)(iVar17 << 2)));
            auVar235 = ZEXT1664(auVar235._0_16_);
            auVar242 = ZEXT1664(auVar242._0_16_);
            auVar246 = ZEXT1664(auVar246._0_16_);
            fVar210 = sqrtf(auVar84._0_4_);
            auVar230 = ZEXT1664(local_720._0_16_);
            bVar74 = local_900[0];
            auVar259 = ZEXT3264(local_760);
            auVar258 = ZEXT3264(local_740);
            auVar257 = ZEXT3264(local_8e0);
            auVar256 = ZEXT3264(local_8c0);
            auVar255 = ZEXT3264(local_8a0);
            auVar254 = ZEXT3264(local_880);
            auVar253 = ZEXT3264(local_860);
            auVar252 = ZEXT3264(local_840);
            auVar251 = ZEXT3264(local_820);
            auVar250 = ZEXT3264(local_800);
            auVar84 = local_700._0_16_;
          }
          else {
            auVar84 = vsqrtss_avx(auVar84,auVar84);
            fVar210 = auVar84._0_4_;
            auVar84 = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar17 << 2)));
          }
          auVar82 = vminps_avx(local_5e0._0_16_,local_620._0_16_);
          auVar85 = vmaxps_avx(local_5e0._0_16_,local_620._0_16_);
          auVar86 = vminps_avx(local_600._0_16_,local_640._0_16_);
          auVar83 = vminps_avx(auVar82,auVar86);
          auVar82 = vmaxps_avx(local_600._0_16_,local_640._0_16_);
          auVar86 = vmaxps_avx(auVar85,auVar82);
          auVar187._8_4_ = 0x7fffffff;
          auVar187._0_8_ = 0x7fffffff7fffffff;
          auVar187._12_4_ = 0x7fffffff;
          auVar85 = vandps_avx(auVar83,auVar187);
          auVar82 = vandps_avx(auVar86,auVar187);
          auVar85 = vmaxps_avx(auVar85,auVar82);
          auVar82 = vmovshdup_avx(auVar85);
          auVar82 = vmaxss_avx(auVar82,auVar85);
          auVar85 = vshufpd_avx(auVar85,auVar85,1);
          auVar85 = vmaxss_avx(auVar85,auVar82);
          fVar139 = auVar85._0_4_ * 1.9073486e-06;
          local_560 = vshufps_avx(auVar86,auVar86,0xff);
          auVar84 = vinsertps_avx(auVar230._0_16_,auVar84,0x10);
          auVar260 = ZEXT1664(auVar84);
          lVar78 = 5;
          do {
            do {
              bVar79 = lVar78 == 0;
              lVar78 = lVar78 + -1;
              if (bVar79) goto LAB_01a38f4a;
              uVar140 = auVar260._0_4_;
              auVar143._4_4_ = uVar140;
              auVar143._0_4_ = uVar140;
              auVar143._8_4_ = uVar140;
              auVar143._12_4_ = uVar140;
              auVar84 = vfmadd132ps_fma(auVar143,ZEXT816(0) << 0x40,local_5a0._0_16_);
              auVar85 = vmovshdup_avx(auVar260._0_16_);
              fVar208 = auVar85._0_4_;
              fVar209 = 1.0 - fVar208;
              fVar204 = fVar208 * fVar208;
              auVar88 = SUB6416(ZEXT464(0x40400000),0);
              auVar87 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar86 = vfmadd213ss_fma(auVar88,auVar85,auVar87);
              auVar82 = vfmadd213ss_fma(auVar86,ZEXT416((uint)fVar204),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar83 = vfmadd213ss_fma(auVar88,ZEXT416((uint)fVar209),auVar87);
              auVar83 = vfmadd213ss_fma(auVar83,ZEXT416((uint)(fVar209 * fVar209)),
                                        SUB6416(ZEXT464(0x40000000),0));
              fVar205 = fVar209 * fVar209 * -fVar208 * 0.5;
              fVar206 = auVar82._0_4_ * 0.5;
              fVar207 = auVar83._0_4_ * 0.5;
              fVar208 = fVar208 * fVar208 * -fVar209 * 0.5;
              auVar188._0_4_ = fVar208 * (float)local_640._0_4_;
              auVar188._4_4_ = fVar208 * (float)local_640._4_4_;
              auVar188._8_4_ = fVar208 * fStack_638;
              auVar188._12_4_ = fVar208 * fStack_634;
              auVar211._4_4_ = fVar207;
              auVar211._0_4_ = fVar207;
              auVar211._8_4_ = fVar207;
              auVar211._12_4_ = fVar207;
              auVar82 = vfmadd132ps_fma(auVar211,auVar188,local_600._0_16_);
              auVar171._4_4_ = fVar206;
              auVar171._0_4_ = fVar206;
              auVar171._8_4_ = fVar206;
              auVar171._12_4_ = fVar206;
              auVar82 = vfmadd132ps_fma(auVar171,auVar82,local_620._0_16_);
              auVar189._4_4_ = fVar205;
              auVar189._0_4_ = fVar205;
              auVar189._8_4_ = fVar205;
              auVar189._12_4_ = fVar205;
              auVar82 = vfmadd132ps_fma(auVar189,auVar82,local_5e0._0_16_);
              auVar83 = vfmadd231ss_fma(auVar87,auVar85,ZEXT416(0x41100000));
              local_4e0._0_16_ = auVar83;
              auVar83 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar85,ZEXT416(0x40800000));
              local_500._0_16_ = auVar83;
              auVar83 = vfmadd213ss_fma(auVar88,auVar85,ZEXT416(0xbf800000));
              local_520._0_16_ = auVar83;
              _local_4c0 = auVar82;
              auVar82 = vsubps_avx(auVar84,auVar82);
              auVar84 = vdpps_avx(auVar82,auVar82,0x7f);
              local_5c0._0_16_ = auVar260._0_16_;
              local_700._0_16_ = auVar82;
              local_720._0_16_ = auVar84;
              local_900._0_16_ = auVar85;
              if (auVar84._0_4_ < 0.0) {
                local_6c0._0_4_ = auVar86._0_4_;
                local_6e0._0_16_ = ZEXT416((uint)fVar209);
                local_660._0_4_ = fVar204;
                local_7b0._0_4_ = fVar209 * -2.0;
                auVar246._0_4_ = sqrtf(auVar84._0_4_);
                auVar246._4_60_ = extraout_var;
                auVar86 = ZEXT416((uint)local_6c0._0_4_);
                auVar84 = auVar246._0_16_;
                auVar85 = local_900._0_16_;
                auVar82 = local_6e0._0_16_;
              }
              else {
                auVar84 = vsqrtss_avx(auVar84,auVar84);
                local_7b0._0_4_ = fVar209 * -2.0;
                local_660._0_4_ = fVar204;
                auVar82 = ZEXT416((uint)fVar209);
              }
              fVar205 = auVar82._0_4_;
              fVar204 = auVar85._0_4_;
              auVar83 = vfnmadd231ss_fma(ZEXT416((uint)(fVar204 * (fVar205 + fVar205))),auVar82,
                                         auVar82);
              auVar82 = vfmadd213ss_fma(auVar86,ZEXT416((uint)(fVar204 + fVar204)),
                                        ZEXT416((uint)(fVar204 * fVar204 * 3.0)));
              auVar86 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar85,
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar205 * fVar205 * -3.0)),
                                        ZEXT416((uint)(fVar205 + fVar205)),auVar86);
              auVar85 = vfmadd213ss_fma(ZEXT416((uint)local_7b0._0_4_),auVar85,
                                        ZEXT416((uint)local_660._0_4_));
              fVar204 = auVar83._0_4_ * 0.5;
              fVar205 = auVar82._0_4_ * 0.5;
              fVar206 = auVar86._0_4_ * 0.5;
              fVar207 = auVar85._0_4_ * 0.5;
              auVar190._0_4_ = fVar207 * (float)local_640._0_4_;
              auVar190._4_4_ = fVar207 * (float)local_640._4_4_;
              auVar190._8_4_ = fVar207 * fStack_638;
              auVar190._12_4_ = fVar207 * fStack_634;
              auVar172._4_4_ = fVar206;
              auVar172._0_4_ = fVar206;
              auVar172._8_4_ = fVar206;
              auVar172._12_4_ = fVar206;
              auVar85 = vfmadd132ps_fma(auVar172,auVar190,local_600._0_16_);
              auVar156._4_4_ = fVar205;
              auVar156._0_4_ = fVar205;
              auVar156._8_4_ = fVar205;
              auVar156._12_4_ = fVar205;
              auVar85 = vfmadd132ps_fma(auVar156,auVar85,local_620._0_16_);
              auVar247._4_4_ = fVar204;
              auVar247._0_4_ = fVar204;
              auVar247._8_4_ = fVar204;
              auVar247._12_4_ = fVar204;
              local_6c0._0_16_ = vfmadd132ps_fma(auVar247,auVar85,local_5e0._0_16_);
              local_660._0_16_ = vdpps_avx(local_6c0._0_16_,local_6c0._0_16_,0x7f);
              auVar64._12_4_ = 0;
              auVar64._0_12_ = ZEXT812(0);
              fVar205 = local_660._0_4_;
              auVar82 = vrsqrt14ss_avx512f(auVar64 << 0x20,ZEXT416((uint)fVar205));
              fVar204 = auVar82._0_4_ * 1.5;
              local_7b0 = vrcp14ss_avx512f(auVar64 << 0x20,ZEXT416((uint)fVar205));
              auVar18._8_4_ = 0x80000000;
              auVar18._0_8_ = 0x8000000080000000;
              auVar18._12_4_ = 0x80000000;
              auVar86 = vxorps_avx512vl(local_660._0_16_,auVar18);
              auVar85 = vfnmadd213ss_fma(local_7b0,local_660._0_16_,SUB6416(ZEXT464(0x40000000),0));
              local_6e0._0_4_ = auVar84._0_4_;
              if (fVar205 < auVar86._0_4_) {
                local_7d0._0_4_ = fVar204;
                local_7c0 = auVar82;
                fVar206 = sqrtf(fVar205);
                auVar84 = ZEXT416((uint)local_6e0._0_4_);
                fVar204 = (float)local_7d0._0_4_;
                auVar82 = local_7c0;
                auVar86 = local_6c0._0_16_;
              }
              else {
                auVar86 = vsqrtss_avx(local_660._0_16_,local_660._0_16_);
                fVar206 = auVar86._0_4_;
                auVar86 = local_6c0._0_16_;
              }
              fVar207 = auVar82._0_4_;
              fVar204 = fVar204 + fVar205 * -0.5 * fVar207 * fVar207 * fVar207;
              auVar212._0_4_ = auVar86._0_4_ * fVar204;
              auVar212._4_4_ = auVar86._4_4_ * fVar204;
              auVar212._8_4_ = auVar86._8_4_ * fVar204;
              auVar212._12_4_ = auVar86._12_4_ * fVar204;
              auVar82 = vdpps_avx(local_700._0_16_,auVar212,0x7f);
              fVar205 = auVar84._0_4_ + 1.0;
              auVar144._0_4_ = auVar82._0_4_ * auVar82._0_4_;
              auVar144._4_4_ = auVar82._4_4_ * auVar82._4_4_;
              auVar144._8_4_ = auVar82._8_4_ * auVar82._8_4_;
              auVar144._12_4_ = auVar82._12_4_ * auVar82._12_4_;
              auVar83 = vsubps_avx512vl(local_720._0_16_,auVar144);
              fVar207 = auVar83._0_4_;
              auVar157._4_12_ = ZEXT812(0) << 0x20;
              auVar157._0_4_ = fVar207;
              auVar87 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar157);
              auVar88 = vmulss_avx512f(auVar83,ZEXT416(0xbf000000));
              if (fVar207 < 0.0) {
                local_7c0._0_4_ = fVar205;
                local_7d0 = auVar82;
                local_550 = fVar204;
                fStack_54c = fVar204;
                fStack_548 = fVar204;
                fStack_544 = fVar204;
                local_540 = auVar212;
                local_530 = auVar87;
                fVar207 = sqrtf(fVar207);
                auVar88 = ZEXT416(auVar88._0_4_);
                auVar84 = ZEXT416((uint)local_6e0._0_4_);
                auVar212 = local_540;
                auVar83 = local_530;
                auVar86 = local_6c0._0_16_;
                fVar205 = (float)local_7c0._0_4_;
                auVar82 = local_7d0;
                fVar204 = local_550;
                fVar208 = fStack_54c;
                fVar209 = fStack_548;
                fVar169 = fStack_544;
              }
              else {
                auVar83 = vsqrtss_avx(auVar83,auVar83);
                fVar207 = auVar83._0_4_;
                auVar83 = auVar87;
                fVar208 = fVar204;
                fVar209 = fVar204;
                fVar169 = fVar204;
              }
              auVar242 = ZEXT1664(local_700._0_16_);
              auVar250 = ZEXT3264(local_800);
              auVar251 = ZEXT3264(local_820);
              auVar252 = ZEXT3264(local_840);
              auVar253 = ZEXT3264(local_860);
              auVar254 = ZEXT3264(local_880);
              auVar255 = ZEXT3264(local_8a0);
              auVar256 = ZEXT3264(local_8c0);
              auVar257 = ZEXT3264(local_8e0);
              auVar258 = ZEXT3264(local_740);
              auVar259 = ZEXT3264(local_760);
              auVar158._0_4_ = (float)local_520._0_4_ * (float)local_640._0_4_;
              auVar158._4_4_ = (float)local_520._0_4_ * (float)local_640._4_4_;
              auVar158._8_4_ = (float)local_520._0_4_ * fStack_638;
              auVar158._12_4_ = (float)local_520._0_4_ * fStack_634;
              auVar173._4_4_ = local_500._0_4_;
              auVar173._0_4_ = local_500._0_4_;
              auVar173._8_4_ = local_500._0_4_;
              auVar173._12_4_ = local_500._0_4_;
              auVar3 = vfmadd132ps_fma(auVar173,auVar158,local_600._0_16_);
              auVar159._4_4_ = local_4e0._0_4_;
              auVar159._0_4_ = local_4e0._0_4_;
              auVar159._8_4_ = local_4e0._0_4_;
              auVar159._12_4_ = local_4e0._0_4_;
              auVar3 = vfmadd132ps_fma(auVar159,auVar3,local_620._0_16_);
              auVar4 = vfmadd213ss_fma(local_900._0_16_,SUB6416(ZEXT464(0xc0400000),0),
                                       ZEXT416(0x40000000));
              uVar140 = auVar4._0_4_;
              auVar174._4_4_ = uVar140;
              auVar174._0_4_ = uVar140;
              auVar174._8_4_ = uVar140;
              auVar174._12_4_ = uVar140;
              auVar3 = vfmadd132ps_fma(auVar174,auVar3,local_5e0._0_16_);
              auVar160._0_4_ = auVar3._0_4_ * (float)local_660._0_4_;
              auVar160._4_4_ = auVar3._4_4_ * (float)local_660._0_4_;
              auVar160._8_4_ = auVar3._8_4_ * (float)local_660._0_4_;
              auVar160._12_4_ = auVar3._12_4_ * (float)local_660._0_4_;
              auVar3 = vdpps_avx(auVar86,auVar3,0x7f);
              fVar170 = auVar3._0_4_;
              auVar175._0_4_ = auVar86._0_4_ * fVar170;
              auVar175._4_4_ = auVar86._4_4_ * fVar170;
              auVar175._8_4_ = auVar86._8_4_ * fVar170;
              auVar175._12_4_ = auVar86._12_4_ * fVar170;
              auVar4 = vsubps_avx(auVar160,auVar175);
              fVar170 = auVar85._0_4_ * (float)local_7b0._0_4_;
              auVar3 = vmaxss_avx(ZEXT416((uint)fVar139),
                                  ZEXT416((uint)(local_5c0._0_4_ * fVar210 * 1.9073486e-06)));
              auVar19._8_4_ = 0x80000000;
              auVar19._0_8_ = 0x8000000080000000;
              auVar19._12_4_ = 0x80000000;
              auVar129._16_16_ = local_760._16_16_;
              auVar89 = vxorps_avx512vl(auVar86,auVar19);
              auVar176._0_4_ = fVar204 * auVar4._0_4_ * fVar170;
              auVar176._4_4_ = fVar208 * auVar4._4_4_ * fVar170;
              auVar176._8_4_ = fVar209 * auVar4._8_4_ * fVar170;
              auVar176._12_4_ = fVar169 * auVar4._12_4_ * fVar170;
              auVar85 = vdpps_avx(auVar89,auVar212,0x7f);
              auVar4 = vfmadd213ss_fma(auVar84,ZEXT416((uint)fVar139),auVar3);
              auVar84 = vdpps_avx(local_700._0_16_,auVar176,0x7f);
              auVar4 = vfmadd213ss_fma(ZEXT416((uint)fVar205),ZEXT416((uint)(fVar139 / fVar206)),
                                       auVar4);
              fVar204 = auVar85._0_4_ + auVar84._0_4_;
              auVar246 = ZEXT464((uint)fVar204);
              auVar84 = vdpps_avx(local_5a0._0_16_,auVar212,0x7f);
              auVar85 = vdpps_avx(local_700._0_16_,auVar89,0x7f);
              auVar88 = vmulss_avx512f(auVar88,auVar83);
              fVar205 = auVar87._0_4_ * 1.5 + auVar88._0_4_ * auVar83._0_4_ * auVar83._0_4_;
              auVar83 = vdpps_avx(local_700._0_16_,local_5a0._0_16_,0x7f);
              auVar88 = vfnmadd231ss_fma(auVar85,auVar82,ZEXT416((uint)fVar204));
              auVar83 = vfnmadd231ss_fma(auVar83,auVar82,auVar84);
              auVar85 = vpermilps_avx(_local_4c0,0xff);
              fVar207 = fVar207 - auVar85._0_4_;
              auVar87 = vshufps_avx(auVar86,auVar86,0xff);
              auVar85 = vfmsub213ss_fma(auVar88,ZEXT416((uint)fVar205),auVar87);
              auVar233._8_4_ = 0x80000000;
              auVar233._0_8_ = 0x8000000080000000;
              auVar233._12_4_ = 0x80000000;
              auVar235 = ZEXT1664(auVar233);
              auVar226._0_8_ = auVar85._0_8_ ^ 0x8000000080000000;
              auVar226._8_4_ = auVar85._8_4_ ^ 0x80000000;
              auVar226._12_4_ = auVar85._12_4_ ^ 0x80000000;
              auVar230 = ZEXT1664(auVar226);
              auVar83 = ZEXT416((uint)(auVar83._0_4_ * fVar205));
              auVar88 = vfmsub231ss_fma(ZEXT416((uint)(auVar84._0_4_ * auVar85._0_4_)),
                                        ZEXT416((uint)fVar204),auVar83);
              auVar85 = vinsertps_avx(auVar226,auVar83,0x1c);
              auVar219._0_8_ = auVar84._0_8_ ^ 0x8000000080000000;
              auVar219._8_4_ = auVar84._8_4_ ^ 0x80000000;
              auVar219._12_4_ = auVar84._12_4_ ^ 0x80000000;
              auVar83 = vinsertps_avx(ZEXT416((uint)fVar204),auVar219,0x10);
              auVar191._0_4_ = auVar88._0_4_;
              auVar191._4_4_ = auVar191._0_4_;
              auVar191._8_4_ = auVar191._0_4_;
              auVar191._12_4_ = auVar191._0_4_;
              auVar84 = vdivps_avx(auVar85,auVar191);
              auVar85 = vdivps_avx(auVar83,auVar191);
              fVar205 = auVar82._0_4_;
              auVar192._0_4_ = fVar205 * auVar84._0_4_ + fVar207 * auVar85._0_4_;
              auVar192._4_4_ = fVar205 * auVar84._4_4_ + fVar207 * auVar85._4_4_;
              auVar192._8_4_ = fVar205 * auVar84._8_4_ + fVar207 * auVar85._8_4_;
              auVar192._12_4_ = fVar205 * auVar84._12_4_ + fVar207 * auVar85._12_4_;
              auVar84 = vsubps_avx(local_5c0._0_16_,auVar192);
              auVar260 = ZEXT1664(auVar84);
              auVar20._8_4_ = 0x7fffffff;
              auVar20._0_8_ = 0x7fffffff7fffffff;
              auVar20._12_4_ = 0x7fffffff;
              auVar85 = vandps_avx512vl(auVar82,auVar20);
            } while (auVar4._0_4_ <= auVar85._0_4_);
            auVar85 = vfmadd231ss_fma(ZEXT416((uint)(auVar4._0_4_ + auVar3._0_4_)),local_560,
                                      ZEXT416(0x36000000));
            auVar21._8_4_ = 0x7fffffff;
            auVar21._0_8_ = 0x7fffffff7fffffff;
            auVar21._12_4_ = 0x7fffffff;
            auVar82 = vandps_avx512vl(ZEXT416((uint)fVar207),auVar21);
          } while (auVar85._0_4_ <= auVar82._0_4_);
          fVar210 = auVar84._0_4_ + (float)local_570._0_4_;
          if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar210) &&
             (fVar139 = (ray->super_RayK<1>).tfar, fVar210 <= fVar139)) {
            auVar84 = vmovshdup_avx(auVar84);
            fVar205 = auVar84._0_4_;
            if ((0.0 <= fVar205) && (fVar205 <= 1.0)) {
              auVar65._12_4_ = 0;
              auVar65._0_12_ = ZEXT412(0);
              auVar129._4_12_ = ZEXT412(0);
              auVar129._0_4_ = local_720._0_4_;
              auVar84 = vrsqrt14ss_avx512f(auVar65 << 0x20,auVar129._0_16_);
              fVar206 = auVar84._0_4_;
              auVar84 = vmulss_avx512f(local_720._0_16_,ZEXT416(0xbf000000));
              pGVar5 = (context->scene->geometries).items[local_910].ptr;
              if ((pGVar5->mask & (ray->super_RayK<1>).mask) != 0) {
                fVar206 = fVar206 * 1.5 + auVar84._0_4_ * fVar206 * fVar206 * fVar206;
                auVar193._0_4_ = local_700._0_4_ * fVar206;
                auVar193._4_4_ = local_700._4_4_ * fVar206;
                auVar193._8_4_ = local_700._8_4_ * fVar206;
                auVar193._12_4_ = local_700._12_4_ * fVar206;
                auVar83 = vfmadd213ps_fma(auVar87,auVar193,auVar86);
                auVar84 = vshufps_avx(auVar193,auVar193,0xc9);
                auVar85 = vshufps_avx(auVar86,auVar86,0xc9);
                auVar194._0_4_ = auVar193._0_4_ * auVar85._0_4_;
                auVar194._4_4_ = auVar193._4_4_ * auVar85._4_4_;
                auVar194._8_4_ = auVar193._8_4_ * auVar85._8_4_;
                auVar194._12_4_ = auVar193._12_4_ * auVar85._12_4_;
                auVar82 = vfmsub231ps_fma(auVar194,auVar86,auVar84);
                auVar84 = vshufps_avx(auVar82,auVar82,0xc9);
                auVar85 = vshufps_avx(auVar83,auVar83,0xc9);
                auVar82 = vshufps_avx(auVar82,auVar82,0xd2);
                auVar145._0_4_ = auVar83._0_4_ * auVar82._0_4_;
                auVar145._4_4_ = auVar83._4_4_ * auVar82._4_4_;
                auVar145._8_4_ = auVar83._8_4_ * auVar82._8_4_;
                auVar145._12_4_ = auVar83._12_4_ * auVar82._12_4_;
                auVar85 = vfmsub231ps_fma(auVar145,auVar84,auVar85);
                auVar84 = vshufps_avx(auVar85,auVar85,0xe9);
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  (ray->super_RayK<1>).tfar = fVar210;
                  uVar14 = vmovlps_avx(auVar84);
                  *(undefined8 *)&(ray->Ng).field_0 = uVar14;
                  (ray->Ng).field_0.field_0.z = auVar85._0_4_;
                  ray->u = fVar205;
                  ray->v = 0.0;
                  ray->primID = (uint)local_908;
                  ray->geomID = (uint)local_910;
                  ray->instID[0] = context->user->instID[0];
                  ray->instPrimID[0] = context->user->instPrimID[0];
                }
                else {
                  local_900._0_4_ = fVar139;
                  local_6a0 = vmovlps_avx(auVar84);
                  local_698 = auVar85._0_4_;
                  local_694 = fVar205;
                  local_690 = 0;
                  local_68c = (uint)local_908;
                  local_688 = (uint)local_910;
                  local_684 = context->user->instID[0];
                  local_680 = context->user->instPrimID[0];
                  (ray->super_RayK<1>).tfar = fVar210;
                  local_914 = -1;
                  local_7a0.valid = &local_914;
                  local_7a0.geometryUserPtr = pGVar5->userPtr;
                  local_7a0.context = context->user;
                  local_7a0.ray = (RTCRayN *)ray;
                  local_7a0.hit = (RTCHitN *)&local_6a0;
                  local_7a0.N = 1;
                  if (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01a39090:
                    p_Var6 = context->args->filter;
                    if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar230 = ZEXT1664(auVar230._0_16_);
                      auVar235 = ZEXT1664(auVar235._0_16_);
                      auVar242 = ZEXT1664(auVar242._0_16_);
                      auVar246 = ZEXT1664(auVar246._0_16_);
                      (*p_Var6)(&local_7a0);
                      auVar259 = ZEXT3264(local_760);
                      auVar258 = ZEXT3264(local_740);
                      auVar257 = ZEXT3264(local_8e0);
                      auVar256 = ZEXT3264(local_8c0);
                      auVar255 = ZEXT3264(local_8a0);
                      auVar254 = ZEXT3264(local_880);
                      auVar253 = ZEXT3264(local_860);
                      auVar252 = ZEXT3264(local_840);
                      auVar251 = ZEXT3264(local_820);
                      auVar250 = ZEXT3264(local_800);
                      if (*local_7a0.valid == 0) goto LAB_01a39177;
                    }
                    (((Vec3f *)((long)local_7a0.ray + 0x30))->field_0).components[0] =
                         *(float *)local_7a0.hit;
                    (((Vec3f *)((long)local_7a0.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_7a0.hit + 4);
                    (((Vec3f *)((long)local_7a0.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_7a0.hit + 8);
                    *(float *)((long)local_7a0.ray + 0x3c) = *(float *)(local_7a0.hit + 0xc);
                    *(float *)((long)local_7a0.ray + 0x40) = *(float *)(local_7a0.hit + 0x10);
                    *(float *)((long)local_7a0.ray + 0x44) = *(float *)(local_7a0.hit + 0x14);
                    *(float *)((long)local_7a0.ray + 0x48) = *(float *)(local_7a0.hit + 0x18);
                    *(float *)((long)local_7a0.ray + 0x4c) = *(float *)(local_7a0.hit + 0x1c);
                    *(float *)((long)local_7a0.ray + 0x50) = *(float *)(local_7a0.hit + 0x20);
                  }
                  else {
                    auVar230 = ZEXT1664(auVar226);
                    auVar235 = ZEXT1664(auVar233);
                    auVar242 = ZEXT1664(local_700._0_16_);
                    auVar246 = ZEXT1664(ZEXT416((uint)fVar204));
                    (*pGVar5->intersectionFilterN)(&local_7a0);
                    auVar259 = ZEXT3264(local_760);
                    auVar258 = ZEXT3264(local_740);
                    auVar257 = ZEXT3264(local_8e0);
                    auVar256 = ZEXT3264(local_8c0);
                    auVar255 = ZEXT3264(local_8a0);
                    auVar254 = ZEXT3264(local_880);
                    auVar253 = ZEXT3264(local_860);
                    auVar252 = ZEXT3264(local_840);
                    auVar251 = ZEXT3264(local_820);
                    auVar250 = ZEXT3264(local_800);
                    if (*local_7a0.valid != 0) goto LAB_01a39090;
LAB_01a39177:
                    (ray->super_RayK<1>).tfar = (float)local_900._0_4_;
                  }
                }
              }
            }
          }
LAB_01a38f4a:
          fVar210 = (ray->super_RayK<1>).tfar;
          auVar35._4_4_ = fVar210;
          auVar35._0_4_ = fVar210;
          auVar35._8_4_ = fVar210;
          auVar35._12_4_ = fVar210;
          auVar35._16_4_ = fVar210;
          auVar35._20_4_ = fVar210;
          auVar35._24_4_ = fVar210;
          auVar35._28_4_ = fVar210;
          uVar14 = vcmpps_avx512vl(_local_400,auVar35,2);
        }
        auVar167._0_4_ = (float)local_480._0_4_ + (float)local_460._0_4_;
        auVar167._4_4_ = (float)local_480._4_4_ + (float)local_460._4_4_;
        auVar167._8_4_ = fStack_478 + fStack_458;
        auVar167._12_4_ = fStack_474 + fStack_454;
        auVar167._16_4_ = fStack_470 + fStack_450;
        auVar167._20_4_ = fStack_46c + fStack_44c;
        auVar167._24_4_ = fStack_468 + fStack_448;
        auVar167._28_4_ = fStack_464 + fStack_444;
        fVar139 = (ray->super_RayK<1>).tfar;
        fVar210 = (ray->super_RayK<1>).tfar;
        auVar36._4_4_ = fVar210;
        auVar36._0_4_ = fVar210;
        auVar36._8_4_ = fVar210;
        auVar36._12_4_ = fVar210;
        auVar36._16_4_ = fVar210;
        auVar36._20_4_ = fVar210;
        auVar36._24_4_ = fVar210;
        auVar36._28_4_ = fVar210;
        uVar14 = vcmpps_avx512vl(auVar167,auVar36,2);
        auVar168._8_4_ = 2;
        auVar168._0_8_ = 0x200000002;
        auVar168._12_4_ = 2;
        auVar168._16_4_ = 2;
        auVar168._20_4_ = 2;
        auVar168._24_4_ = 2;
        auVar168._28_4_ = 2;
        auVar37._8_4_ = 3;
        auVar37._0_8_ = 0x300000003;
        auVar37._12_4_ = 3;
        auVar37._16_4_ = 3;
        auVar37._20_4_ = 3;
        auVar37._24_4_ = 3;
        auVar37._28_4_ = 3;
        auVar95 = vpblendmd_avx512vl(auVar168,auVar37);
        bVar79 = (bool)((byte)local_768 & 1);
        local_460._0_4_ = (uint)bVar79 * auVar95._0_4_ | (uint)!bVar79 * 2;
        bVar79 = (bool)((byte)(local_768 >> 1) & 1);
        local_460._4_4_ = (uint)bVar79 * auVar95._4_4_ | (uint)!bVar79 * 2;
        bVar79 = (bool)((byte)(local_768 >> 2) & 1);
        fStack_458 = (float)((uint)bVar79 * auVar95._8_4_ | (uint)!bVar79 * 2);
        bVar79 = (bool)((byte)(local_768 >> 3) & 1);
        fStack_454 = (float)((uint)bVar79 * auVar95._12_4_ | (uint)!bVar79 * 2);
        bVar79 = (bool)((byte)(local_768 >> 4) & 1);
        fStack_450 = (float)((uint)bVar79 * auVar95._16_4_ | (uint)!bVar79 * 2);
        bVar79 = (bool)((byte)(local_768 >> 5) & 1);
        fStack_44c = (float)((uint)bVar79 * auVar95._20_4_ | (uint)!bVar79 * 2);
        bVar79 = (bool)((byte)(local_768 >> 6) & 1);
        fStack_448 = (float)((uint)bVar79 * auVar95._24_4_ | (uint)!bVar79 * 2);
        bVar79 = (bool)((byte)(local_768 >> 7) & 1);
        fStack_444 = (float)((uint)bVar79 * auVar95._28_4_ | (uint)!bVar79 * 2);
        bVar72 = (byte)uVar15 & bVar72 & (byte)uVar14;
        uVar14 = vpcmpd_avx512vl(_local_460,local_3a0,2);
        bVar76 = (byte)uVar14 & bVar72;
        local_3e0 = _local_340;
        local_400._4_4_ = (float)local_480._4_4_ + (float)local_340._4_4_;
        local_400._0_4_ = (float)local_480._0_4_ + (float)local_340._0_4_;
        fStack_3f8 = fStack_478 + fStack_338;
        fStack_3f4 = fStack_474 + fStack_334;
        fStack_3f0 = fStack_470 + fStack_330;
        fStack_3ec = fStack_46c + fStack_32c;
        fStack_3e8 = fStack_468 + fStack_328;
        fStack_3e4 = fStack_464 + fStack_324;
        while (auVar95 = local_900, auVar260 = ZEXT3264(auVar93), bVar76 != 0) {
          auVar155._8_4_ = 0x7f800000;
          auVar155._0_8_ = 0x7f8000007f800000;
          auVar155._12_4_ = 0x7f800000;
          auVar155._16_4_ = 0x7f800000;
          auVar155._20_4_ = 0x7f800000;
          auVar155._24_4_ = 0x7f800000;
          auVar155._28_4_ = 0x7f800000;
          auVar93 = vblendmps_avx512vl(auVar155,local_3e0);
          auVar130._0_4_ =
               (uint)(bVar76 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar76 & 1) * 0x7f800000;
          bVar79 = (bool)(bVar76 >> 1 & 1);
          auVar130._4_4_ = (uint)bVar79 * auVar93._4_4_ | (uint)!bVar79 * 0x7f800000;
          bVar79 = (bool)(bVar76 >> 2 & 1);
          auVar130._8_4_ = (uint)bVar79 * auVar93._8_4_ | (uint)!bVar79 * 0x7f800000;
          bVar79 = (bool)(bVar76 >> 3 & 1);
          auVar130._12_4_ = (uint)bVar79 * auVar93._12_4_ | (uint)!bVar79 * 0x7f800000;
          bVar79 = (bool)(bVar76 >> 4 & 1);
          auVar130._16_4_ = (uint)bVar79 * auVar93._16_4_ | (uint)!bVar79 * 0x7f800000;
          bVar79 = (bool)(bVar76 >> 5 & 1);
          auVar130._20_4_ = (uint)bVar79 * auVar93._20_4_ | (uint)!bVar79 * 0x7f800000;
          bVar79 = (bool)(bVar76 >> 6 & 1);
          auVar130._24_4_ = (uint)bVar79 * auVar93._24_4_ | (uint)!bVar79 * 0x7f800000;
          auVar130._28_4_ =
               (uint)(bVar76 >> 7) * auVar93._28_4_ | (uint)!(bool)(bVar76 >> 7) * 0x7f800000;
          auVar93 = vshufps_avx(auVar130,auVar130,0xb1);
          auVar93 = vminps_avx(auVar130,auVar93);
          auVar96 = vshufpd_avx(auVar93,auVar93,5);
          auVar93 = vminps_avx(auVar93,auVar96);
          auVar96 = vpermpd_avx2(auVar93,0x4e);
          auVar93 = vminps_avx(auVar93,auVar96);
          uVar14 = vcmpps_avx512vl(auVar130,auVar93,0);
          bVar73 = (byte)uVar14 & bVar76;
          bVar74 = bVar76;
          if (bVar73 != 0) {
            bVar74 = bVar73;
          }
          iVar17 = 0;
          for (uVar81 = (uint)bVar74; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x80000000) {
            iVar17 = iVar17 + 1;
          }
          auVar230 = ZEXT464(*(uint *)(local_320 + (uint)(iVar17 << 2)));
          aVar1 = (ray->super_RayK<1>).dir.field_0;
          local_5a0._0_16_ = (undefined1  [16])aVar1;
          auVar84 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
          if (auVar84._0_4_ < 0.0) {
            local_900[1] = 0;
            local_900[0] = bVar76;
            local_900._2_30_ = auVar95._2_30_;
            local_700._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar17 << 2)));
            local_720._0_16_ = ZEXT416(*(uint *)(local_320 + (uint)(iVar17 << 2)));
            auVar235 = ZEXT1664(auVar235._0_16_);
            auVar242 = ZEXT1664(auVar242._0_16_);
            auVar246 = ZEXT1664(auVar246._0_16_);
            fVar210 = sqrtf(auVar84._0_4_);
            auVar230 = ZEXT1664(local_720._0_16_);
            bVar76 = local_900[0];
            auVar259 = ZEXT3264(local_760);
            auVar258 = ZEXT3264(local_740);
            auVar257 = ZEXT3264(local_8e0);
            auVar256 = ZEXT3264(local_8c0);
            auVar255 = ZEXT3264(local_8a0);
            auVar254 = ZEXT3264(local_880);
            auVar253 = ZEXT3264(local_860);
            auVar252 = ZEXT3264(local_840);
            auVar251 = ZEXT3264(local_820);
            auVar250 = ZEXT3264(local_800);
            auVar84 = local_700._0_16_;
          }
          else {
            auVar84 = vsqrtss_avx(auVar84,auVar84);
            fVar210 = auVar84._0_4_;
            auVar84 = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar17 << 2)));
          }
          auVar82 = vminps_avx(local_5e0._0_16_,local_620._0_16_);
          auVar85 = vmaxps_avx(local_5e0._0_16_,local_620._0_16_);
          auVar86 = vminps_avx(local_600._0_16_,local_640._0_16_);
          auVar83 = vminps_avx(auVar82,auVar86);
          auVar82 = vmaxps_avx(local_600._0_16_,local_640._0_16_);
          auVar86 = vmaxps_avx(auVar85,auVar82);
          auVar195._8_4_ = 0x7fffffff;
          auVar195._0_8_ = 0x7fffffff7fffffff;
          auVar195._12_4_ = 0x7fffffff;
          auVar85 = vandps_avx(auVar83,auVar195);
          auVar82 = vandps_avx(auVar86,auVar195);
          auVar85 = vmaxps_avx(auVar85,auVar82);
          auVar82 = vmovshdup_avx(auVar85);
          auVar82 = vmaxss_avx(auVar82,auVar85);
          auVar85 = vshufpd_avx(auVar85,auVar85,1);
          auVar85 = vmaxss_avx(auVar85,auVar82);
          fVar139 = auVar85._0_4_ * 1.9073486e-06;
          local_560 = vshufps_avx(auVar86,auVar86,0xff);
          auVar84 = vinsertps_avx(auVar230._0_16_,auVar84,0x10);
          auVar260 = ZEXT1664(auVar84);
          lVar78 = 5;
          do {
            do {
              bVar79 = lVar78 == 0;
              lVar78 = lVar78 + -1;
              if (bVar79) goto LAB_01a39b73;
              uVar140 = auVar260._0_4_;
              auVar146._4_4_ = uVar140;
              auVar146._0_4_ = uVar140;
              auVar146._8_4_ = uVar140;
              auVar146._12_4_ = uVar140;
              auVar84 = vfmadd132ps_fma(auVar146,ZEXT816(0) << 0x40,local_5a0._0_16_);
              auVar85 = vmovshdup_avx(auVar260._0_16_);
              fVar208 = auVar85._0_4_;
              fVar209 = 1.0 - fVar208;
              fVar204 = fVar208 * fVar208;
              auVar88 = SUB6416(ZEXT464(0x40400000),0);
              auVar87 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar86 = vfmadd213ss_fma(auVar88,auVar85,auVar87);
              auVar82 = vfmadd213ss_fma(auVar86,ZEXT416((uint)fVar204),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar83 = vfmadd213ss_fma(auVar88,ZEXT416((uint)fVar209),auVar87);
              auVar83 = vfmadd213ss_fma(auVar83,ZEXT416((uint)(fVar209 * fVar209)),
                                        SUB6416(ZEXT464(0x40000000),0));
              fVar205 = fVar209 * fVar209 * -fVar208 * 0.5;
              fVar206 = auVar82._0_4_ * 0.5;
              fVar207 = auVar83._0_4_ * 0.5;
              fVar208 = fVar208 * fVar208 * -fVar209 * 0.5;
              auVar196._0_4_ = fVar208 * (float)local_640._0_4_;
              auVar196._4_4_ = fVar208 * (float)local_640._4_4_;
              auVar196._8_4_ = fVar208 * fStack_638;
              auVar196._12_4_ = fVar208 * fStack_634;
              auVar213._4_4_ = fVar207;
              auVar213._0_4_ = fVar207;
              auVar213._8_4_ = fVar207;
              auVar213._12_4_ = fVar207;
              auVar82 = vfmadd132ps_fma(auVar213,auVar196,local_600._0_16_);
              auVar177._4_4_ = fVar206;
              auVar177._0_4_ = fVar206;
              auVar177._8_4_ = fVar206;
              auVar177._12_4_ = fVar206;
              auVar82 = vfmadd132ps_fma(auVar177,auVar82,local_620._0_16_);
              auVar197._4_4_ = fVar205;
              auVar197._0_4_ = fVar205;
              auVar197._8_4_ = fVar205;
              auVar197._12_4_ = fVar205;
              auVar82 = vfmadd132ps_fma(auVar197,auVar82,local_5e0._0_16_);
              auVar83 = vfmadd231ss_fma(auVar87,auVar85,ZEXT416(0x41100000));
              local_4e0._0_16_ = auVar83;
              auVar83 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar85,ZEXT416(0x40800000));
              local_500._0_16_ = auVar83;
              auVar83 = vfmadd213ss_fma(auVar88,auVar85,ZEXT416(0xbf800000));
              local_520._0_16_ = auVar83;
              _local_4c0 = auVar82;
              auVar82 = vsubps_avx(auVar84,auVar82);
              auVar84 = vdpps_avx(auVar82,auVar82,0x7f);
              local_5c0._0_16_ = auVar260._0_16_;
              local_700._0_16_ = auVar82;
              local_720._0_16_ = auVar84;
              local_900._0_16_ = auVar85;
              if (auVar84._0_4_ < 0.0) {
                local_6c0._0_4_ = auVar86._0_4_;
                local_6e0._0_16_ = ZEXT416((uint)fVar209);
                local_660._0_4_ = fVar204;
                local_7b0._0_4_ = fVar209 * -2.0;
                auVar235._0_4_ = sqrtf(auVar84._0_4_);
                auVar235._4_60_ = extraout_var_00;
                auVar86 = ZEXT416((uint)local_6c0._0_4_);
                auVar84 = auVar235._0_16_;
                auVar85 = local_900._0_16_;
                auVar82 = local_6e0._0_16_;
              }
              else {
                auVar84 = vsqrtss_avx(auVar84,auVar84);
                local_7b0._0_4_ = fVar209 * -2.0;
                local_660._0_4_ = fVar204;
                auVar82 = ZEXT416((uint)fVar209);
              }
              fVar205 = auVar82._0_4_;
              fVar204 = auVar85._0_4_;
              auVar83 = vfnmadd231ss_fma(ZEXT416((uint)(fVar204 * (fVar205 + fVar205))),auVar82,
                                         auVar82);
              auVar82 = vfmadd213ss_fma(auVar86,ZEXT416((uint)(fVar204 + fVar204)),
                                        ZEXT416((uint)(fVar204 * fVar204 * 3.0)));
              auVar86 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar85,
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar205 * fVar205 * -3.0)),
                                        ZEXT416((uint)(fVar205 + fVar205)),auVar86);
              auVar85 = vfmadd213ss_fma(ZEXT416((uint)local_7b0._0_4_),auVar85,
                                        ZEXT416((uint)local_660._0_4_));
              fVar204 = auVar83._0_4_ * 0.5;
              fVar205 = auVar82._0_4_ * 0.5;
              fVar206 = auVar86._0_4_ * 0.5;
              fVar207 = auVar85._0_4_ * 0.5;
              auVar198._0_4_ = fVar207 * (float)local_640._0_4_;
              auVar198._4_4_ = fVar207 * (float)local_640._4_4_;
              auVar198._8_4_ = fVar207 * fStack_638;
              auVar198._12_4_ = fVar207 * fStack_634;
              auVar178._4_4_ = fVar206;
              auVar178._0_4_ = fVar206;
              auVar178._8_4_ = fVar206;
              auVar178._12_4_ = fVar206;
              auVar85 = vfmadd132ps_fma(auVar178,auVar198,local_600._0_16_);
              auVar161._4_4_ = fVar205;
              auVar161._0_4_ = fVar205;
              auVar161._8_4_ = fVar205;
              auVar161._12_4_ = fVar205;
              auVar85 = vfmadd132ps_fma(auVar161,auVar85,local_620._0_16_);
              auVar248._4_4_ = fVar204;
              auVar248._0_4_ = fVar204;
              auVar248._8_4_ = fVar204;
              auVar248._12_4_ = fVar204;
              local_6c0._0_16_ = vfmadd132ps_fma(auVar248,auVar85,local_5e0._0_16_);
              local_660._0_16_ = vdpps_avx(local_6c0._0_16_,local_6c0._0_16_,0x7f);
              auVar66._12_4_ = 0;
              auVar66._0_12_ = ZEXT812(0);
              fVar205 = local_660._0_4_;
              auVar82 = vrsqrt14ss_avx512f(auVar66 << 0x20,ZEXT416((uint)fVar205));
              fVar204 = auVar82._0_4_ * 1.5;
              local_7b0 = vrcp14ss_avx512f(auVar66 << 0x20,ZEXT416((uint)fVar205));
              auVar22._8_4_ = 0x80000000;
              auVar22._0_8_ = 0x8000000080000000;
              auVar22._12_4_ = 0x80000000;
              auVar86 = vxorps_avx512vl(local_660._0_16_,auVar22);
              auVar85 = vfnmadd213ss_fma(local_7b0,local_660._0_16_,SUB6416(ZEXT464(0x40000000),0));
              local_6e0._0_4_ = auVar84._0_4_;
              if (fVar205 < auVar86._0_4_) {
                local_7d0._0_4_ = fVar204;
                local_7c0 = auVar82;
                fVar206 = sqrtf(fVar205);
                auVar84 = ZEXT416((uint)local_6e0._0_4_);
                fVar204 = (float)local_7d0._0_4_;
                auVar82 = local_7c0;
                auVar86 = local_6c0._0_16_;
              }
              else {
                auVar86 = vsqrtss_avx(local_660._0_16_,local_660._0_16_);
                fVar206 = auVar86._0_4_;
                auVar86 = local_6c0._0_16_;
              }
              fVar207 = auVar82._0_4_;
              fVar204 = fVar204 + fVar205 * -0.5 * fVar207 * fVar207 * fVar207;
              auVar214._0_4_ = auVar86._0_4_ * fVar204;
              auVar214._4_4_ = auVar86._4_4_ * fVar204;
              auVar214._8_4_ = auVar86._8_4_ * fVar204;
              auVar214._12_4_ = auVar86._12_4_ * fVar204;
              auVar82 = vdpps_avx(local_700._0_16_,auVar214,0x7f);
              fVar205 = auVar84._0_4_ + 1.0;
              auVar147._0_4_ = auVar82._0_4_ * auVar82._0_4_;
              auVar147._4_4_ = auVar82._4_4_ * auVar82._4_4_;
              auVar147._8_4_ = auVar82._8_4_ * auVar82._8_4_;
              auVar147._12_4_ = auVar82._12_4_ * auVar82._12_4_;
              auVar83 = vsubps_avx512vl(local_720._0_16_,auVar147);
              fVar207 = auVar83._0_4_;
              auVar162._4_12_ = ZEXT812(0) << 0x20;
              auVar162._0_4_ = fVar207;
              auVar87 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar162);
              auVar88 = vmulss_avx512f(auVar83,ZEXT416(0xbf000000));
              if (fVar207 < 0.0) {
                local_7c0._0_4_ = fVar205;
                local_7d0 = auVar82;
                local_550 = fVar204;
                fStack_54c = fVar204;
                fStack_548 = fVar204;
                fStack_544 = fVar204;
                local_540 = auVar214;
                local_530 = auVar87;
                fVar207 = sqrtf(fVar207);
                auVar88 = ZEXT416(auVar88._0_4_);
                auVar84 = ZEXT416((uint)local_6e0._0_4_);
                auVar214 = local_540;
                auVar83 = local_530;
                auVar86 = local_6c0._0_16_;
                fVar205 = (float)local_7c0._0_4_;
                auVar82 = local_7d0;
                fVar204 = local_550;
                fVar208 = fStack_54c;
                fVar209 = fStack_548;
                fVar169 = fStack_544;
              }
              else {
                auVar83 = vsqrtss_avx(auVar83,auVar83);
                fVar207 = auVar83._0_4_;
                auVar83 = auVar87;
                fVar208 = fVar204;
                fVar209 = fVar204;
                fVar169 = fVar204;
              }
              auVar242 = ZEXT1664(local_700._0_16_);
              auVar250 = ZEXT3264(local_800);
              auVar251 = ZEXT3264(local_820);
              auVar252 = ZEXT3264(local_840);
              auVar253 = ZEXT3264(local_860);
              auVar254 = ZEXT3264(local_880);
              auVar255 = ZEXT3264(local_8a0);
              auVar256 = ZEXT3264(local_8c0);
              auVar257 = ZEXT3264(local_8e0);
              auVar258 = ZEXT3264(local_740);
              auVar259 = ZEXT3264(local_760);
              auVar163._0_4_ = (float)local_520._0_4_ * (float)local_640._0_4_;
              auVar163._4_4_ = (float)local_520._0_4_ * (float)local_640._4_4_;
              auVar163._8_4_ = (float)local_520._0_4_ * fStack_638;
              auVar163._12_4_ = (float)local_520._0_4_ * fStack_634;
              auVar179._4_4_ = local_500._0_4_;
              auVar179._0_4_ = local_500._0_4_;
              auVar179._8_4_ = local_500._0_4_;
              auVar179._12_4_ = local_500._0_4_;
              auVar3 = vfmadd132ps_fma(auVar179,auVar163,local_600._0_16_);
              auVar164._4_4_ = local_4e0._0_4_;
              auVar164._0_4_ = local_4e0._0_4_;
              auVar164._8_4_ = local_4e0._0_4_;
              auVar164._12_4_ = local_4e0._0_4_;
              auVar3 = vfmadd132ps_fma(auVar164,auVar3,local_620._0_16_);
              auVar4 = vfmadd213ss_fma(local_900._0_16_,SUB6416(ZEXT464(0xc0400000),0),
                                       ZEXT416(0x40000000));
              uVar140 = auVar4._0_4_;
              auVar180._4_4_ = uVar140;
              auVar180._0_4_ = uVar140;
              auVar180._8_4_ = uVar140;
              auVar180._12_4_ = uVar140;
              auVar3 = vfmadd132ps_fma(auVar180,auVar3,local_5e0._0_16_);
              auVar165._0_4_ = auVar3._0_4_ * (float)local_660._0_4_;
              auVar165._4_4_ = auVar3._4_4_ * (float)local_660._0_4_;
              auVar165._8_4_ = auVar3._8_4_ * (float)local_660._0_4_;
              auVar165._12_4_ = auVar3._12_4_ * (float)local_660._0_4_;
              auVar3 = vdpps_avx(auVar86,auVar3,0x7f);
              fVar170 = auVar3._0_4_;
              auVar181._0_4_ = auVar86._0_4_ * fVar170;
              auVar181._4_4_ = auVar86._4_4_ * fVar170;
              auVar181._8_4_ = auVar86._8_4_ * fVar170;
              auVar181._12_4_ = auVar86._12_4_ * fVar170;
              auVar4 = vsubps_avx(auVar165,auVar181);
              fVar170 = auVar85._0_4_ * (float)local_7b0._0_4_;
              auVar3 = vmaxss_avx(ZEXT416((uint)fVar139),
                                  ZEXT416((uint)(local_5c0._0_4_ * fVar210 * 1.9073486e-06)));
              auVar23._8_4_ = 0x80000000;
              auVar23._0_8_ = 0x8000000080000000;
              auVar23._12_4_ = 0x80000000;
              auVar131._16_16_ = local_760._16_16_;
              auVar89 = vxorps_avx512vl(auVar86,auVar23);
              auVar182._0_4_ = fVar204 * auVar4._0_4_ * fVar170;
              auVar182._4_4_ = fVar208 * auVar4._4_4_ * fVar170;
              auVar182._8_4_ = fVar209 * auVar4._8_4_ * fVar170;
              auVar182._12_4_ = fVar169 * auVar4._12_4_ * fVar170;
              auVar85 = vdpps_avx(auVar89,auVar214,0x7f);
              auVar4 = vfmadd213ss_fma(auVar84,ZEXT416((uint)fVar139),auVar3);
              auVar84 = vdpps_avx(local_700._0_16_,auVar182,0x7f);
              auVar4 = vfmadd213ss_fma(ZEXT416((uint)fVar205),ZEXT416((uint)(fVar139 / fVar206)),
                                       auVar4);
              fVar204 = auVar85._0_4_ + auVar84._0_4_;
              auVar246 = ZEXT464((uint)fVar204);
              auVar84 = vdpps_avx(local_5a0._0_16_,auVar214,0x7f);
              auVar85 = vdpps_avx(local_700._0_16_,auVar89,0x7f);
              auVar88 = vmulss_avx512f(auVar88,auVar83);
              fVar205 = auVar87._0_4_ * 1.5 + auVar88._0_4_ * auVar83._0_4_ * auVar83._0_4_;
              auVar83 = vdpps_avx(local_700._0_16_,local_5a0._0_16_,0x7f);
              auVar88 = vfnmadd231ss_fma(auVar85,auVar82,ZEXT416((uint)fVar204));
              auVar83 = vfnmadd231ss_fma(auVar83,auVar82,auVar84);
              auVar85 = vpermilps_avx(_local_4c0,0xff);
              fVar207 = fVar207 - auVar85._0_4_;
              auVar87 = vshufps_avx(auVar86,auVar86,0xff);
              auVar85 = vfmsub213ss_fma(auVar88,ZEXT416((uint)fVar205),auVar87);
              auVar234._8_4_ = 0x80000000;
              auVar234._0_8_ = 0x8000000080000000;
              auVar234._12_4_ = 0x80000000;
              auVar235 = ZEXT1664(auVar234);
              auVar227._0_8_ = auVar85._0_8_ ^ 0x8000000080000000;
              auVar227._8_4_ = auVar85._8_4_ ^ 0x80000000;
              auVar227._12_4_ = auVar85._12_4_ ^ 0x80000000;
              auVar230 = ZEXT1664(auVar227);
              auVar83 = ZEXT416((uint)(auVar83._0_4_ * fVar205));
              auVar88 = vfmsub231ss_fma(ZEXT416((uint)(auVar84._0_4_ * auVar85._0_4_)),
                                        ZEXT416((uint)fVar204),auVar83);
              auVar85 = vinsertps_avx(auVar227,auVar83,0x1c);
              auVar220._0_8_ = auVar84._0_8_ ^ 0x8000000080000000;
              auVar220._8_4_ = auVar84._8_4_ ^ 0x80000000;
              auVar220._12_4_ = auVar84._12_4_ ^ 0x80000000;
              auVar83 = vinsertps_avx(ZEXT416((uint)fVar204),auVar220,0x10);
              auVar199._0_4_ = auVar88._0_4_;
              auVar199._4_4_ = auVar199._0_4_;
              auVar199._8_4_ = auVar199._0_4_;
              auVar199._12_4_ = auVar199._0_4_;
              auVar84 = vdivps_avx(auVar85,auVar199);
              auVar85 = vdivps_avx(auVar83,auVar199);
              fVar205 = auVar82._0_4_;
              auVar200._0_4_ = fVar205 * auVar84._0_4_ + fVar207 * auVar85._0_4_;
              auVar200._4_4_ = fVar205 * auVar84._4_4_ + fVar207 * auVar85._4_4_;
              auVar200._8_4_ = fVar205 * auVar84._8_4_ + fVar207 * auVar85._8_4_;
              auVar200._12_4_ = fVar205 * auVar84._12_4_ + fVar207 * auVar85._12_4_;
              auVar84 = vsubps_avx(local_5c0._0_16_,auVar200);
              auVar260 = ZEXT1664(auVar84);
              auVar24._8_4_ = 0x7fffffff;
              auVar24._0_8_ = 0x7fffffff7fffffff;
              auVar24._12_4_ = 0x7fffffff;
              auVar85 = vandps_avx512vl(auVar82,auVar24);
            } while (auVar4._0_4_ <= auVar85._0_4_);
            auVar85 = vfmadd231ss_fma(ZEXT416((uint)(auVar4._0_4_ + auVar3._0_4_)),local_560,
                                      ZEXT416(0x36000000));
            auVar25._8_4_ = 0x7fffffff;
            auVar25._0_8_ = 0x7fffffff7fffffff;
            auVar25._12_4_ = 0x7fffffff;
            auVar82 = vandps_avx512vl(ZEXT416((uint)fVar207),auVar25);
          } while (auVar85._0_4_ <= auVar82._0_4_);
          fVar210 = auVar84._0_4_ + (float)local_570._0_4_;
          if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar210) &&
             (fVar139 = (ray->super_RayK<1>).tfar, fVar210 <= fVar139)) {
            auVar84 = vmovshdup_avx(auVar84);
            fVar205 = auVar84._0_4_;
            if ((0.0 <= fVar205) && (fVar205 <= 1.0)) {
              auVar67._12_4_ = 0;
              auVar67._0_12_ = ZEXT412(0);
              auVar131._4_12_ = ZEXT412(0);
              auVar131._0_4_ = local_720._0_4_;
              auVar84 = vrsqrt14ss_avx512f(auVar67 << 0x20,auVar131._0_16_);
              fVar206 = auVar84._0_4_;
              auVar84 = vmulss_avx512f(local_720._0_16_,ZEXT416(0xbf000000));
              pGVar5 = (context->scene->geometries).items[local_910].ptr;
              if ((pGVar5->mask & (ray->super_RayK<1>).mask) != 0) {
                fVar206 = fVar206 * 1.5 + auVar84._0_4_ * fVar206 * fVar206 * fVar206;
                auVar201._0_4_ = local_700._0_4_ * fVar206;
                auVar201._4_4_ = local_700._4_4_ * fVar206;
                auVar201._8_4_ = local_700._8_4_ * fVar206;
                auVar201._12_4_ = local_700._12_4_ * fVar206;
                auVar83 = vfmadd213ps_fma(auVar87,auVar201,auVar86);
                auVar84 = vshufps_avx(auVar201,auVar201,0xc9);
                auVar85 = vshufps_avx(auVar86,auVar86,0xc9);
                auVar202._0_4_ = auVar201._0_4_ * auVar85._0_4_;
                auVar202._4_4_ = auVar201._4_4_ * auVar85._4_4_;
                auVar202._8_4_ = auVar201._8_4_ * auVar85._8_4_;
                auVar202._12_4_ = auVar201._12_4_ * auVar85._12_4_;
                auVar82 = vfmsub231ps_fma(auVar202,auVar86,auVar84);
                auVar84 = vshufps_avx(auVar82,auVar82,0xc9);
                auVar85 = vshufps_avx(auVar83,auVar83,0xc9);
                auVar82 = vshufps_avx(auVar82,auVar82,0xd2);
                auVar148._0_4_ = auVar83._0_4_ * auVar82._0_4_;
                auVar148._4_4_ = auVar83._4_4_ * auVar82._4_4_;
                auVar148._8_4_ = auVar83._8_4_ * auVar82._8_4_;
                auVar148._12_4_ = auVar83._12_4_ * auVar82._12_4_;
                auVar85 = vfmsub231ps_fma(auVar148,auVar84,auVar85);
                auVar84 = vshufps_avx(auVar85,auVar85,0xe9);
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  (ray->super_RayK<1>).tfar = fVar210;
                  uVar14 = vmovlps_avx(auVar84);
                  *(undefined8 *)&(ray->Ng).field_0 = uVar14;
                  (ray->Ng).field_0.field_0.z = auVar85._0_4_;
                  ray->u = fVar205;
                  ray->v = 0.0;
                  ray->primID = (uint)local_908;
                  ray->geomID = (uint)local_910;
                  ray->instID[0] = context->user->instID[0];
                  ray->instPrimID[0] = context->user->instPrimID[0];
                }
                else {
                  local_900._0_4_ = fVar139;
                  local_6a0 = vmovlps_avx(auVar84);
                  local_698 = auVar85._0_4_;
                  local_694 = fVar205;
                  local_690 = 0;
                  local_68c = (uint)local_908;
                  local_688 = (uint)local_910;
                  local_684 = context->user->instID[0];
                  local_680 = context->user->instPrimID[0];
                  (ray->super_RayK<1>).tfar = fVar210;
                  local_914 = -1;
                  local_7a0.valid = &local_914;
                  local_7a0.geometryUserPtr = pGVar5->userPtr;
                  local_7a0.context = context->user;
                  local_7a0.ray = (RTCRayN *)ray;
                  local_7a0.hit = (RTCHitN *)&local_6a0;
                  local_7a0.N = 1;
                  if (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01a39cc9:
                    p_Var6 = context->args->filter;
                    if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar230 = ZEXT1664(auVar230._0_16_);
                      auVar235 = ZEXT1664(auVar235._0_16_);
                      auVar242 = ZEXT1664(auVar242._0_16_);
                      auVar246 = ZEXT1664(auVar246._0_16_);
                      (*p_Var6)(&local_7a0);
                      auVar259 = ZEXT3264(local_760);
                      auVar258 = ZEXT3264(local_740);
                      auVar257 = ZEXT3264(local_8e0);
                      auVar256 = ZEXT3264(local_8c0);
                      auVar255 = ZEXT3264(local_8a0);
                      auVar254 = ZEXT3264(local_880);
                      auVar253 = ZEXT3264(local_860);
                      auVar252 = ZEXT3264(local_840);
                      auVar251 = ZEXT3264(local_820);
                      auVar250 = ZEXT3264(local_800);
                      if (*local_7a0.valid == 0) goto LAB_01a39db0;
                    }
                    (((Vec3f *)((long)local_7a0.ray + 0x30))->field_0).components[0] =
                         *(float *)local_7a0.hit;
                    (((Vec3f *)((long)local_7a0.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_7a0.hit + 4);
                    (((Vec3f *)((long)local_7a0.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_7a0.hit + 8);
                    *(float *)((long)local_7a0.ray + 0x3c) = *(float *)(local_7a0.hit + 0xc);
                    *(float *)((long)local_7a0.ray + 0x40) = *(float *)(local_7a0.hit + 0x10);
                    *(float *)((long)local_7a0.ray + 0x44) = *(float *)(local_7a0.hit + 0x14);
                    *(float *)((long)local_7a0.ray + 0x48) = *(float *)(local_7a0.hit + 0x18);
                    *(float *)((long)local_7a0.ray + 0x4c) = *(float *)(local_7a0.hit + 0x1c);
                    *(float *)((long)local_7a0.ray + 0x50) = *(float *)(local_7a0.hit + 0x20);
                  }
                  else {
                    auVar230 = ZEXT1664(auVar227);
                    auVar235 = ZEXT1664(auVar234);
                    auVar242 = ZEXT1664(local_700._0_16_);
                    auVar246 = ZEXT1664(ZEXT416((uint)fVar204));
                    (*pGVar5->intersectionFilterN)(&local_7a0);
                    auVar259 = ZEXT3264(local_760);
                    auVar258 = ZEXT3264(local_740);
                    auVar257 = ZEXT3264(local_8e0);
                    auVar256 = ZEXT3264(local_8c0);
                    auVar255 = ZEXT3264(local_8a0);
                    auVar254 = ZEXT3264(local_880);
                    auVar253 = ZEXT3264(local_860);
                    auVar252 = ZEXT3264(local_840);
                    auVar251 = ZEXT3264(local_820);
                    auVar250 = ZEXT3264(local_800);
                    if (*local_7a0.valid != 0) goto LAB_01a39cc9;
LAB_01a39db0:
                    (ray->super_RayK<1>).tfar = (float)local_900._0_4_;
                  }
                }
              }
            }
          }
LAB_01a39b73:
          fVar139 = (ray->super_RayK<1>).tfar;
          fVar210 = (ray->super_RayK<1>).tfar;
          auVar38._4_4_ = fVar210;
          auVar38._0_4_ = fVar210;
          auVar38._8_4_ = fVar210;
          auVar38._12_4_ = fVar210;
          auVar38._16_4_ = fVar210;
          auVar38._20_4_ = fVar210;
          auVar38._24_4_ = fVar210;
          auVar38._28_4_ = fVar210;
          uVar14 = vcmpps_avx512vl(_local_400,auVar38,2);
          bVar76 = ~('\x01' << ((byte)iVar17 & 0x1f)) & bVar76 & (byte)uVar14;
          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        }
        uVar16 = vpcmpd_avx512vl(local_3a0,local_300,1);
        uVar15 = vpcmpd_avx512vl(local_3a0,_local_460,1);
        auVar185._0_4_ = (float)local_480._0_4_ + (float)local_380._0_4_;
        auVar185._4_4_ = (float)local_480._4_4_ + (float)local_380._4_4_;
        auVar185._8_4_ = fStack_478 + fStack_378;
        auVar185._12_4_ = fStack_474 + fStack_374;
        auVar185._16_4_ = fStack_470 + fStack_370;
        auVar185._20_4_ = fStack_46c + fStack_36c;
        auVar185._24_4_ = fStack_468 + fStack_368;
        auVar185._28_4_ = fStack_464 + fStack_364;
        auVar203._4_4_ = fVar139;
        auVar203._0_4_ = fVar139;
        auVar203._8_4_ = fVar139;
        auVar203._12_4_ = fVar139;
        auVar203._16_4_ = fVar139;
        auVar203._20_4_ = fVar139;
        auVar203._24_4_ = fVar139;
        auVar203._28_4_ = fVar139;
        uVar14 = vcmpps_avx512vl(auVar185,auVar203,2);
        bVar76 = (byte)local_764 & (byte)uVar16 & (byte)uVar14;
        auVar186._0_4_ = (float)local_480._0_4_ + (float)local_340._0_4_;
        auVar186._4_4_ = (float)local_480._4_4_ + (float)local_340._4_4_;
        auVar186._8_4_ = fStack_478 + fStack_338;
        auVar186._12_4_ = fStack_474 + fStack_334;
        auVar186._16_4_ = fStack_470 + fStack_330;
        auVar186._20_4_ = fStack_46c + fStack_32c;
        auVar186._24_4_ = fStack_468 + fStack_328;
        auVar186._28_4_ = fStack_464 + fStack_324;
        uVar14 = vcmpps_avx512vl(auVar186,auVar203,2);
        bVar72 = bVar72 & (byte)uVar15 & (byte)uVar14 | bVar76;
        prim = local_670;
        if (bVar72 != 0) {
          abStack_180[uVar75 * 0x60] = bVar72;
          bVar79 = (bool)(bVar76 >> 1 & 1);
          bVar7 = (bool)(bVar76 >> 2 & 1);
          bVar8 = (bool)(bVar76 >> 3 & 1);
          bVar9 = (bool)(bVar76 >> 4 & 1);
          bVar10 = (bool)(bVar76 >> 5 & 1);
          bVar11 = (bool)(bVar76 >> 6 & 1);
          auStack_160[uVar75 * 0x18] =
               (uint)(bVar76 & 1) * local_380._0_4_ | (uint)!(bool)(bVar76 & 1) * local_340._0_4_;
          auStack_160[uVar75 * 0x18 + 1] =
               (uint)bVar79 * local_380._4_4_ | (uint)!bVar79 * local_340._4_4_;
          auStack_160[uVar75 * 0x18 + 2] =
               (uint)bVar7 * (int)fStack_378 | (uint)!bVar7 * (int)fStack_338;
          auStack_160[uVar75 * 0x18 + 3] =
               (uint)bVar8 * (int)fStack_374 | (uint)!bVar8 * (int)fStack_334;
          auStack_160[uVar75 * 0x18 + 4] =
               (uint)bVar9 * (int)fStack_370 | (uint)!bVar9 * (int)fStack_330;
          auStack_160[uVar75 * 0x18 + 5] =
               (uint)bVar10 * (int)fStack_36c | (uint)!bVar10 * (int)fStack_32c;
          auStack_160[uVar75 * 0x18 + 6] =
               (uint)bVar11 * (int)fStack_368 | (uint)!bVar11 * (int)fStack_328;
          auStack_160[uVar75 * 0x18 + 7] =
               (uint)(bVar76 >> 7) * (int)fStack_364 | (uint)!(bool)(bVar76 >> 7) * (int)fStack_324;
          uVar80 = vmovlps_avx(local_3b0);
          (&uStack_140)[uVar75 * 0xc] = uVar80;
          aiStack_138[uVar75 * 0x18] = local_76c + 1;
          uVar75 = (ulong)((int)uVar75 + 1);
        }
      }
    }
    fVar210 = (ray->super_RayK<1>).tfar;
    auVar151._4_4_ = fVar210;
    auVar151._0_4_ = fVar210;
    auVar151._8_4_ = fVar210;
    auVar151._12_4_ = fVar210;
    auVar151._16_4_ = fVar210;
    auVar151._20_4_ = fVar210;
    auVar151._24_4_ = fVar210;
    auVar151._28_4_ = fVar210;
    do {
      uVar81 = (uint)uVar75;
      uVar75 = (ulong)(uVar81 - 1);
      if (uVar81 == 0) {
        uVar14 = vcmpps_avx512vl(auVar151,local_2e0,0xd);
        local_668 = (ulong)((uint)local_668 & (uint)uVar14);
        goto LAB_01a37603;
      }
      auVar95 = *(undefined1 (*) [32])(auStack_160 + uVar75 * 0x18);
      auVar183._0_4_ = auVar95._0_4_ + (float)local_480._0_4_;
      auVar183._4_4_ = auVar95._4_4_ + (float)local_480._4_4_;
      auVar183._8_4_ = auVar95._8_4_ + fStack_478;
      auVar183._12_4_ = auVar95._12_4_ + fStack_474;
      auVar183._16_4_ = auVar95._16_4_ + fStack_470;
      auVar183._20_4_ = auVar95._20_4_ + fStack_46c;
      auVar183._24_4_ = auVar95._24_4_ + fStack_468;
      auVar183._28_4_ = auVar95._28_4_ + fStack_464;
      uVar14 = vcmpps_avx512vl(auVar183,auVar151,2);
      uVar132 = (uint)uVar14 & (uint)abStack_180[uVar75 * 0x60];
    } while (uVar132 == 0);
    uVar80 = (&uStack_140)[uVar75 * 0xc];
    auVar142._8_8_ = 0;
    auVar142._0_8_ = uVar80;
    auVar184._8_4_ = 0x7f800000;
    auVar184._0_8_ = 0x7f8000007f800000;
    auVar184._12_4_ = 0x7f800000;
    auVar184._16_4_ = 0x7f800000;
    auVar184._20_4_ = 0x7f800000;
    auVar184._24_4_ = 0x7f800000;
    auVar184._28_4_ = 0x7f800000;
    auVar93 = vblendmps_avx512vl(auVar184,auVar95);
    bVar72 = (byte)uVar132;
    auVar127._0_4_ =
         (uint)(bVar72 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar72 & 1) * (int)auVar95._0_4_;
    bVar79 = (bool)((byte)(uVar132 >> 1) & 1);
    auVar127._4_4_ = (uint)bVar79 * auVar93._4_4_ | (uint)!bVar79 * (int)auVar95._4_4_;
    bVar79 = (bool)((byte)(uVar132 >> 2) & 1);
    auVar127._8_4_ = (uint)bVar79 * auVar93._8_4_ | (uint)!bVar79 * (int)auVar95._8_4_;
    bVar79 = (bool)((byte)(uVar132 >> 3) & 1);
    auVar127._12_4_ = (uint)bVar79 * auVar93._12_4_ | (uint)!bVar79 * (int)auVar95._12_4_;
    bVar79 = (bool)((byte)(uVar132 >> 4) & 1);
    auVar127._16_4_ = (uint)bVar79 * auVar93._16_4_ | (uint)!bVar79 * (int)auVar95._16_4_;
    bVar79 = (bool)((byte)(uVar132 >> 5) & 1);
    auVar127._20_4_ = (uint)bVar79 * auVar93._20_4_ | (uint)!bVar79 * (int)auVar95._20_4_;
    bVar79 = (bool)((byte)(uVar132 >> 6) & 1);
    auVar127._24_4_ = (uint)bVar79 * auVar93._24_4_ | (uint)!bVar79 * (int)auVar95._24_4_;
    auVar127._28_4_ =
         (uVar132 >> 7) * auVar93._28_4_ | (uint)!SUB41(uVar132 >> 7,0) * (int)auVar95._28_4_;
    auVar95 = vshufps_avx(auVar127,auVar127,0xb1);
    auVar95 = vminps_avx(auVar127,auVar95);
    auVar93 = vshufpd_avx(auVar95,auVar95,5);
    auVar95 = vminps_avx(auVar95,auVar93);
    auVar93 = vpermpd_avx2(auVar95,0x4e);
    auVar95 = vminps_avx(auVar95,auVar93);
    uVar14 = vcmpps_avx512vl(auVar127,auVar95,0);
    bVar76 = (byte)uVar14 & bVar72;
    if (bVar76 != 0) {
      uVar132 = (uint)bVar76;
    }
    uVar133 = 0;
    for (; (uVar132 & 1) == 0; uVar132 = uVar132 >> 1 | 0x80000000) {
      uVar133 = uVar133 + 1;
    }
    local_76c = aiStack_138[uVar75 * 0x18];
    bVar72 = ~('\x01' << ((byte)uVar133 & 0x1f)) & bVar72;
    abStack_180[uVar75 * 0x60] = bVar72;
    if (bVar72 == 0) {
      uVar81 = uVar81 - 1;
    }
    uVar140 = (undefined4)uVar80;
    auVar166._4_4_ = uVar140;
    auVar166._0_4_ = uVar140;
    auVar166._8_4_ = uVar140;
    auVar166._12_4_ = uVar140;
    auVar166._16_4_ = uVar140;
    auVar166._20_4_ = uVar140;
    auVar166._24_4_ = uVar140;
    auVar166._28_4_ = uVar140;
    auVar84 = vmovshdup_avx(auVar142);
    auVar84 = vsubps_avx(auVar84,auVar142);
    auVar152._0_4_ = auVar84._0_4_;
    auVar152._4_4_ = auVar152._0_4_;
    auVar152._8_4_ = auVar152._0_4_;
    auVar152._12_4_ = auVar152._0_4_;
    auVar152._16_4_ = auVar152._0_4_;
    auVar152._20_4_ = auVar152._0_4_;
    auVar152._24_4_ = auVar152._0_4_;
    auVar152._28_4_ = auVar152._0_4_;
    auVar84 = vfmadd132ps_fma(auVar152,auVar166,_DAT_01f7b040);
    _local_380 = ZEXT1632(auVar84);
    local_3b0._8_8_ = 0;
    local_3b0._0_8_ = *(ulong *)(local_380 + (ulong)uVar133 * 4);
    uVar75 = (ulong)uVar81;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }